

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx2::CurveNiIntersectorK<4,4>::
     intersect_h<embree::avx2::RibbonCurve1IntersectorK<embree::HermiteCurveT,4,8>,embree::avx2::Intersect1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  undefined1 (*pauVar1) [28];
  float *pfVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  undefined1 auVar5 [32];
  Primitive PVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  Geometry *pGVar10;
  RTCFilterFunctionN p_Var11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  long lVar21;
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  float fVar71;
  float fVar72;
  undefined1 auVar73 [28];
  uint uVar74;
  uint uVar75;
  ulong uVar76;
  long lVar77;
  uint uVar78;
  ulong uVar79;
  long lVar80;
  LinearSpace3fa *pLVar81;
  float fVar82;
  undefined8 uVar83;
  float fVar102;
  vint4 bi_2;
  undefined1 auVar84 [16];
  float fVar104;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  float fVar106;
  float fVar107;
  float fVar108;
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  float fVar101;
  float fVar103;
  float fVar105;
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar89 [16];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined4 uVar109;
  vint4 bi_1;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [64];
  float fVar129;
  float fVar130;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  vint4 ai_2;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  float fVar156;
  undefined1 auVar152 [32];
  undefined1 auVar149 [16];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  vint4 ai;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  vint4 bi;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [64];
  undefined1 auVar175 [32];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined4 uVar179;
  vint4 ai_1;
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [64];
  undefined1 auVar186 [16];
  float fVar193;
  float fVar194;
  float fVar195;
  undefined1 auVar192 [64];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [32];
  undefined1 auVar199 [16];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [64];
  float fVar204;
  float fVar210;
  undefined1 auVar205 [16];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [64];
  float fVar216;
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [32];
  float fVar217;
  float fVar218;
  float fVar219;
  float fVar220;
  undefined1 auVar215 [64];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  undefined1 local_860 [144];
  undefined8 local_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined1 local_7b0 [16];
  LinearSpace3fa *local_798;
  Precalculations *local_790;
  Primitive *local_788;
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_730 [8];
  undefined8 uStack_728;
  undefined1 local_720 [16];
  RTCFilterFunctionNArguments local_710;
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  RayQueryContext *local_658;
  undefined1 (*local_650) [16];
  RayHitK<4> *local_648;
  undefined1 local_640 [32];
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  undefined1 local_600 [32];
  undefined1 local_5d0 [8];
  uint uStack_5c8;
  uint uStack_5c4;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined1 local_5a0 [2] [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  float local_440;
  float fStack_43c;
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined4 local_410;
  undefined4 uStack_40c;
  undefined4 uStack_408;
  undefined4 uStack_404;
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  undefined4 local_3d0;
  undefined4 uStack_3cc;
  undefined4 uStack_3c8;
  undefined4 uStack_3c4;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined1 local_3b0 [16];
  uint local_3a0;
  uint uStack_39c;
  uint uStack_398;
  uint uStack_394;
  uint uStack_390;
  uint uStack_38c;
  uint uStack_388;
  uint uStack_384;
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  uint local_2b0;
  uint uStack_2ac;
  uint uStack_2a8;
  uint uStack_2a4;
  undefined1 local_2a0 [16];
  undefined1 local_290 [16];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  int local_220;
  int local_21c;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined1 local_160 [32];
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  undefined4 uStack_104;
  undefined1 local_100 [32];
  float local_e0;
  float fStack_dc;
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar206 [32];
  
  PVar6 = prim[1];
  uVar79 = (ulong)(byte)PVar6;
  fVar130 = *(float *)(prim + uVar79 * 0x19 + 0x12);
  auVar151 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar151 = vinsertps_avx(auVar151,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar12 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar12 = vinsertps_avx(auVar12,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar151 = vsubps_avx(auVar151,*(undefined1 (*) [16])(prim + uVar79 * 0x19 + 6));
  auVar84._0_4_ = fVar130 * auVar151._0_4_;
  auVar84._4_4_ = fVar130 * auVar151._4_4_;
  auVar84._8_4_ = fVar130 * auVar151._8_4_;
  auVar84._12_4_ = fVar130 * auVar151._12_4_;
  auVar163._0_4_ = fVar130 * auVar12._0_4_;
  auVar163._4_4_ = fVar130 * auVar12._4_4_;
  auVar163._8_4_ = fVar130 * auVar12._8_4_;
  auVar163._12_4_ = fVar130 * auVar12._12_4_;
  auVar151 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 * 4 + 6)));
  auVar151 = vcvtdq2ps_avx(auVar151);
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 * 5 + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar13 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 * 6 + 6)));
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar14 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 * 0xb + 6)));
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar6 * 0xc) + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar6 * 0xc + uVar79 + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  uVar76 = (ulong)(uint)((int)(uVar79 * 9) * 2);
  auVar87 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar76 + 6)));
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar86 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar76 + uVar79 + 6)));
  auVar86 = vcvtdq2ps_avx(auVar86);
  uVar76 = (ulong)(uint)((int)(uVar79 * 5) << 2);
  auVar131 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar76 + 6)));
  auVar131 = vcvtdq2ps_avx(auVar131);
  auVar211._4_4_ = auVar163._0_4_;
  auVar211._0_4_ = auVar163._0_4_;
  auVar211._8_4_ = auVar163._0_4_;
  auVar211._12_4_ = auVar163._0_4_;
  auVar111 = vshufps_avx(auVar163,auVar163,0x55);
  auVar85 = vshufps_avx(auVar163,auVar163,0xaa);
  fVar130 = auVar85._0_4_;
  auVar199._0_4_ = fVar130 * auVar13._0_4_;
  fVar129 = auVar85._4_4_;
  auVar199._4_4_ = fVar129 * auVar13._4_4_;
  fVar102 = auVar85._8_4_;
  auVar199._8_4_ = fVar102 * auVar13._8_4_;
  fVar104 = auVar85._12_4_;
  auVar199._12_4_ = fVar104 * auVar13._12_4_;
  auVar196._0_4_ = auVar16._0_4_ * fVar130;
  auVar196._4_4_ = auVar16._4_4_ * fVar129;
  auVar196._8_4_ = auVar16._8_4_ * fVar102;
  auVar196._12_4_ = auVar16._12_4_ * fVar104;
  auVar180._0_4_ = auVar131._0_4_ * fVar130;
  auVar180._4_4_ = auVar131._4_4_ * fVar129;
  auVar180._8_4_ = auVar131._8_4_ * fVar102;
  auVar180._12_4_ = auVar131._12_4_ * fVar104;
  auVar85 = vfmadd231ps_fma(auVar199,auVar111,auVar12);
  auVar112 = vfmadd231ps_fma(auVar196,auVar111,auVar15);
  auVar111 = vfmadd231ps_fma(auVar180,auVar86,auVar111);
  auVar147 = vfmadd231ps_fma(auVar85,auVar211,auVar151);
  auVar112 = vfmadd231ps_fma(auVar112,auVar211,auVar14);
  auVar158 = vfmadd231ps_fma(auVar111,auVar87,auVar211);
  auVar212._4_4_ = auVar84._0_4_;
  auVar212._0_4_ = auVar84._0_4_;
  auVar212._8_4_ = auVar84._0_4_;
  auVar212._12_4_ = auVar84._0_4_;
  auVar111 = vshufps_avx(auVar84,auVar84,0x55);
  auVar85 = vshufps_avx(auVar84,auVar84,0xaa);
  fVar130 = auVar85._0_4_;
  auVar164._0_4_ = fVar130 * auVar13._0_4_;
  fVar129 = auVar85._4_4_;
  auVar164._4_4_ = fVar129 * auVar13._4_4_;
  fVar102 = auVar85._8_4_;
  auVar164._8_4_ = fVar102 * auVar13._8_4_;
  fVar104 = auVar85._12_4_;
  auVar164._12_4_ = fVar104 * auVar13._12_4_;
  auVar110._0_4_ = auVar16._0_4_ * fVar130;
  auVar110._4_4_ = auVar16._4_4_ * fVar129;
  auVar110._8_4_ = auVar16._8_4_ * fVar102;
  auVar110._12_4_ = auVar16._12_4_ * fVar104;
  auVar85._0_4_ = auVar131._0_4_ * fVar130;
  auVar85._4_4_ = auVar131._4_4_ * fVar129;
  auVar85._8_4_ = auVar131._8_4_ * fVar102;
  auVar85._12_4_ = auVar131._12_4_ * fVar104;
  auVar12 = vfmadd231ps_fma(auVar164,auVar111,auVar12);
  auVar13 = vfmadd231ps_fma(auVar110,auVar111,auVar15);
  auVar15 = vfmadd231ps_fma(auVar85,auVar111,auVar86);
  auVar16 = vfmadd231ps_fma(auVar12,auVar212,auVar151);
  auVar86 = vfmadd231ps_fma(auVar13,auVar212,auVar14);
  auVar131 = vfmadd231ps_fma(auVar15,auVar212,auVar87);
  local_290._8_4_ = 0x7fffffff;
  local_290._0_8_ = 0x7fffffff7fffffff;
  local_290._12_4_ = 0x7fffffff;
  auVar151 = vandps_avx(auVar147,local_290);
  auVar157._8_4_ = 0x219392ef;
  auVar157._0_8_ = 0x219392ef219392ef;
  auVar157._12_4_ = 0x219392ef;
  auVar151 = vcmpps_avx(auVar151,auVar157,1);
  auVar12 = vblendvps_avx(auVar147,auVar157,auVar151);
  auVar151 = vandps_avx(auVar112,local_290);
  auVar151 = vcmpps_avx(auVar151,auVar157,1);
  auVar13 = vblendvps_avx(auVar112,auVar157,auVar151);
  auVar151 = vandps_avx(auVar158,local_290);
  auVar151 = vcmpps_avx(auVar151,auVar157,1);
  auVar151 = vblendvps_avx(auVar158,auVar157,auVar151);
  auVar14 = vrcpps_avx(auVar12);
  auVar176._8_4_ = 0x3f800000;
  auVar176._0_8_ = 0x3f8000003f800000;
  auVar176._12_4_ = 0x3f800000;
  auVar12 = vfnmadd213ps_fma(auVar12,auVar14,auVar176);
  auVar14 = vfmadd132ps_fma(auVar12,auVar14,auVar14);
  auVar12 = vrcpps_avx(auVar13);
  auVar13 = vfnmadd213ps_fma(auVar13,auVar12,auVar176);
  auVar15 = vfmadd132ps_fma(auVar13,auVar12,auVar12);
  auVar12 = vrcpps_avx(auVar151);
  auVar151 = vfnmadd213ps_fma(auVar151,auVar12,auVar176);
  auVar87 = vfmadd132ps_fma(auVar151,auVar12,auVar12);
  auVar151._8_8_ = 0;
  auVar151._0_8_ = *(ulong *)(prim + uVar79 * 7 + 6);
  auVar151 = vpmovsxwd_avx(auVar151);
  auVar151 = vcvtdq2ps_avx(auVar151);
  auVar151 = vsubps_avx(auVar151,auVar16);
  auVar158._0_4_ = auVar14._0_4_ * auVar151._0_4_;
  auVar158._4_4_ = auVar14._4_4_ * auVar151._4_4_;
  auVar158._8_4_ = auVar14._8_4_ * auVar151._8_4_;
  auVar158._12_4_ = auVar14._12_4_ * auVar151._12_4_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar79 * 9 + 6);
  auVar151 = vpmovsxwd_avx(auVar12);
  auVar151 = vcvtdq2ps_avx(auVar151);
  auVar151 = vsubps_avx(auVar151,auVar16);
  auVar165._0_4_ = auVar14._0_4_ * auVar151._0_4_;
  auVar165._4_4_ = auVar14._4_4_ * auVar151._4_4_;
  auVar165._8_4_ = auVar14._8_4_ * auVar151._8_4_;
  auVar165._12_4_ = auVar14._12_4_ * auVar151._12_4_;
  auVar112._1_3_ = 0;
  auVar112[0] = PVar6;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar6 * 0x10 + 6);
  auVar12 = vpmovsxwd_avx(auVar13);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar79 * -2 + 6);
  auVar151 = vpmovsxwd_avx(auVar14);
  auVar151 = vcvtdq2ps_avx(auVar151);
  auVar151 = vsubps_avx(auVar151,auVar86);
  auVar181._0_4_ = auVar151._0_4_ * auVar15._0_4_;
  auVar181._4_4_ = auVar151._4_4_ * auVar15._4_4_;
  auVar181._8_4_ = auVar151._8_4_ * auVar15._8_4_;
  auVar181._12_4_ = auVar151._12_4_ * auVar15._12_4_;
  auVar151 = vcvtdq2ps_avx(auVar12);
  auVar151 = vsubps_avx(auVar151,auVar86);
  auVar111._0_4_ = auVar15._0_4_ * auVar151._0_4_;
  auVar111._4_4_ = auVar15._4_4_ * auVar151._4_4_;
  auVar111._8_4_ = auVar15._8_4_ * auVar151._8_4_;
  auVar111._12_4_ = auVar15._12_4_ * auVar151._12_4_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar76 + uVar79 + 6);
  auVar151 = vpmovsxwd_avx(auVar15);
  auVar151 = vcvtdq2ps_avx(auVar151);
  auVar151 = vsubps_avx(auVar151,auVar131);
  auVar147._0_4_ = auVar87._0_4_ * auVar151._0_4_;
  auVar147._4_4_ = auVar87._4_4_ * auVar151._4_4_;
  auVar147._8_4_ = auVar87._8_4_ * auVar151._8_4_;
  auVar147._12_4_ = auVar87._12_4_ * auVar151._12_4_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar79 * 0x17 + 6);
  auVar151 = vpmovsxwd_avx(auVar16);
  auVar151 = vcvtdq2ps_avx(auVar151);
  auVar151 = vsubps_avx(auVar151,auVar131);
  auVar86._0_4_ = auVar87._0_4_ * auVar151._0_4_;
  auVar86._4_4_ = auVar87._4_4_ * auVar151._4_4_;
  auVar86._8_4_ = auVar87._8_4_ * auVar151._8_4_;
  auVar86._12_4_ = auVar87._12_4_ * auVar151._12_4_;
  auVar151 = vpminsd_avx(auVar158,auVar165);
  auVar12 = vpminsd_avx(auVar181,auVar111);
  auVar151 = vmaxps_avx(auVar151,auVar12);
  auVar12 = vpminsd_avx(auVar147,auVar86);
  uVar109 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar186._4_4_ = uVar109;
  auVar186._0_4_ = uVar109;
  auVar186._8_4_ = uVar109;
  auVar186._12_4_ = uVar109;
  auVar12 = vmaxps_avx(auVar12,auVar186);
  auVar151 = vmaxps_avx(auVar151,auVar12);
  local_2a0._0_4_ = auVar151._0_4_ * 0.99999964;
  local_2a0._4_4_ = auVar151._4_4_ * 0.99999964;
  local_2a0._8_4_ = auVar151._8_4_ * 0.99999964;
  local_2a0._12_4_ = auVar151._12_4_ * 0.99999964;
  auVar151 = vpmaxsd_avx(auVar158,auVar165);
  auVar12 = vpmaxsd_avx(auVar181,auVar111);
  auVar151 = vminps_avx(auVar151,auVar12);
  auVar12 = vpmaxsd_avx(auVar147,auVar86);
  uVar109 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar131._4_4_ = uVar109;
  auVar131._0_4_ = uVar109;
  auVar131._8_4_ = uVar109;
  auVar131._12_4_ = uVar109;
  auVar12 = vminps_avx(auVar12,auVar131);
  auVar151 = vminps_avx(auVar151,auVar12);
  auVar87._0_4_ = auVar151._0_4_ * 1.0000004;
  auVar87._4_4_ = auVar151._4_4_ * 1.0000004;
  auVar87._8_4_ = auVar151._8_4_ * 1.0000004;
  auVar87._12_4_ = auVar151._12_4_ * 1.0000004;
  auVar112[4] = PVar6;
  auVar112._5_3_ = 0;
  auVar112[8] = PVar6;
  auVar112._9_3_ = 0;
  auVar112[0xc] = PVar6;
  auVar112._13_3_ = 0;
  auVar12 = vpcmpgtd_avx(auVar112,_DAT_01f7fcf0);
  auVar151 = vcmpps_avx(local_2a0,auVar87,2);
  auVar151 = vandps_avx(auVar151,auVar12);
  uVar74 = vmovmskps_avx(auVar151);
  if (uVar74 != 0) {
    uVar74 = uVar74 & 0xff;
    pLVar81 = pre->ray_space + k;
    local_5a0[1]._0_8_ = mm_lookupmask_ps._16_8_;
    local_5a0[1]._8_8_ = mm_lookupmask_ps._24_8_;
    local_5a0[1]._16_8_ = mm_lookupmask_ps._16_8_;
    local_5a0[1]._24_8_ = mm_lookupmask_ps._24_8_;
    local_650 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
    local_798 = pLVar81;
    local_790 = pre;
    local_788 = prim;
    do {
      lVar21 = 0;
      for (uVar76 = (ulong)uVar74; (uVar76 & 1) == 0; uVar76 = uVar76 >> 1 | 0x8000000000000000) {
        lVar21 = lVar21 + 1;
      }
      uVar7 = *(uint *)(prim + 2);
      uVar8 = *(uint *)(prim + lVar21 * 4 + 6);
      pGVar10 = (context->scene->geometries).items[uVar7].ptr;
      uVar76 = (ulong)*(uint *)(*(long *)&pGVar10->field_0x58 +
                               (ulong)uVar8 *
                               pGVar10[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      lVar80 = (long)pGVar10[1].intersectionFilterN * uVar76;
      lVar77 = (long)pGVar10[1].intersectionFilterN * (uVar76 + 1);
      lVar21 = *(long *)&pGVar10[1].time_range.upper;
      local_720 = *(undefined1 (*) [16])(lVar21 + lVar80);
      _local_730 = *(undefined1 (*) [16])(lVar21 + lVar77);
      uVar109 = *(undefined4 *)(lVar21 + 0xc + lVar80);
      auVar177._4_4_ = uVar109;
      auVar177._0_4_ = uVar109;
      auVar177._8_4_ = uVar109;
      auVar177._12_4_ = uVar109;
      local_100._16_4_ = uVar109;
      local_100._0_16_ = auVar177;
      local_100._20_4_ = uVar109;
      local_100._24_4_ = uVar109;
      local_100._28_4_ = uVar109;
      iVar9 = (int)pGVar10[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      fVar130 = *(float *)(lVar21 + 0xc + lVar77);
      auVar213._4_4_ = fVar130;
      auVar213._0_4_ = fVar130;
      auVar213._8_4_ = fVar130;
      auVar213._12_4_ = fVar130;
      fStack_110 = fVar130;
      _local_120 = auVar213;
      fStack_10c = fVar130;
      fStack_108 = fVar130;
      uStack_104 = fVar130;
      lVar21 = (long)iVar9 * 0x44;
      auVar151 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x1c);
      auVar151 = vinsertps_avx(auVar151,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
      auVar113._8_4_ = 0xbeaaaaab;
      auVar113._0_8_ = 0xbeaaaaabbeaaaaab;
      auVar113._12_4_ = 0xbeaaaaab;
      auVar85 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                                  (pGVar10[2].intersectionFilterN +
                                  uVar76 * (long)pGVar10[2].pointQueryFunc),local_720,auVar113);
      auVar16 = vfmadd132ps_fma(*(undefined1 (*) [16])
                                 (pGVar10[2].intersectionFilterN +
                                 (long)pGVar10[2].pointQueryFunc * (uVar76 + 1)),_local_730,auVar113
                               );
      auVar13 = vsubps_avx(local_720,auVar151);
      uVar109 = auVar13._0_4_;
      auVar132._4_4_ = uVar109;
      auVar132._0_4_ = uVar109;
      auVar132._8_4_ = uVar109;
      auVar132._12_4_ = uVar109;
      auVar12 = vshufps_avx(auVar13,auVar13,0x55);
      auVar13 = vshufps_avx(auVar13,auVar13,0xaa);
      aVar3 = (pLVar81->vx).field_0;
      aVar4 = (pLVar81->vy).field_0;
      fVar129 = (pLVar81->vz).field_0.m128[0];
      fVar102 = *(float *)((long)&(pLVar81->vz).field_0 + 4);
      fVar104 = *(float *)((long)&(pLVar81->vz).field_0 + 8);
      fVar193 = *(float *)((long)&(pLVar81->vz).field_0 + 0xc);
      auVar182._0_4_ = fVar129 * auVar13._0_4_;
      auVar182._4_4_ = fVar102 * auVar13._4_4_;
      auVar182._8_4_ = fVar104 * auVar13._8_4_;
      auVar182._12_4_ = fVar193 * auVar13._12_4_;
      auVar12 = vfmadd231ps_fma(auVar182,(undefined1  [16])aVar4,auVar12);
      auVar87 = vfmadd231ps_fma(auVar12,(undefined1  [16])aVar3,auVar132);
      auVar14 = vinsertps_avx(auVar87,auVar177,0x30);
      auVar13 = vsubps_avx(auVar85,auVar151);
      uVar109 = auVar13._0_4_;
      auVar148._4_4_ = uVar109;
      auVar148._0_4_ = uVar109;
      auVar148._8_4_ = uVar109;
      auVar148._12_4_ = uVar109;
      auVar12 = vshufps_avx(auVar13,auVar13,0x55);
      auVar13 = vshufps_avx(auVar13,auVar13,0xaa);
      auVar197._0_4_ = fVar129 * auVar13._0_4_;
      auVar197._4_4_ = fVar102 * auVar13._4_4_;
      auVar197._8_4_ = fVar104 * auVar13._8_4_;
      auVar197._12_4_ = fVar193 * auVar13._12_4_;
      auVar12 = vfmadd231ps_fma(auVar197,(undefined1  [16])aVar4,auVar12);
      auVar86 = vfmadd231ps_fma(auVar12,(undefined1  [16])aVar3,auVar148);
      auVar15 = vsubps_avx(auVar16,auVar151);
      auVar12 = vshufps_avx(auVar15,auVar15,0x55);
      auVar13 = vshufps_avx(auVar15,auVar15,0xaa);
      auVar178._0_4_ = fVar129 * auVar13._0_4_;
      auVar178._4_4_ = fVar102 * auVar13._4_4_;
      auVar178._8_4_ = fVar104 * auVar13._8_4_;
      auVar178._12_4_ = fVar193 * auVar13._12_4_;
      auVar13 = vfmadd231ps_fma(auVar178,(undefined1  [16])aVar4,auVar12);
      auVar12 = vblendps_avx(auVar86,auVar85,8);
      auVar133._0_4_ = auVar15._0_4_;
      auVar133._4_4_ = auVar133._0_4_;
      auVar133._8_4_ = auVar133._0_4_;
      auVar133._12_4_ = auVar133._0_4_;
      auVar131 = vfmadd231ps_fma(auVar13,(undefined1  [16])aVar3,auVar133);
      auVar15 = vsubps_avx(_local_730,auVar151);
      auVar151 = vshufps_avx(auVar15,auVar15,0xaa);
      auVar205._0_4_ = fVar129 * auVar151._0_4_;
      auVar205._4_4_ = fVar102 * auVar151._4_4_;
      auVar205._8_4_ = fVar104 * auVar151._8_4_;
      auVar205._12_4_ = fVar193 * auVar151._12_4_;
      auVar151 = vshufps_avx(auVar15,auVar15,0x55);
      auVar151 = vfmadd231ps_fma(auVar205,(undefined1  [16])aVar4,auVar151);
      auVar13 = vblendps_avx(auVar131,auVar16,8);
      auVar88._0_4_ = auVar15._0_4_;
      auVar88._4_4_ = auVar88._0_4_;
      auVar88._8_4_ = auVar88._0_4_;
      auVar88._12_4_ = auVar88._0_4_;
      auVar111 = vfmadd231ps_fma(auVar151,(undefined1  [16])aVar3,auVar88);
      auVar15 = vinsertps_avx(auVar111,auVar213,0x30);
      auVar151 = vandps_avx(auVar14,local_290);
      auVar12 = vandps_avx(auVar12,local_290);
      auVar14 = vmaxps_avx(auVar151,auVar12);
      auVar151 = vandps_avx(auVar13,local_290);
      auVar12 = vandps_avx(auVar15,local_290);
      auVar151 = vmaxps_avx(auVar151,auVar12);
      auVar151 = vmaxps_avx(auVar14,auVar151);
      auVar12 = vmovshdup_avx(auVar151);
      auVar12 = vmaxss_avx(auVar12,auVar151);
      auVar151 = vshufpd_avx(auVar151,auVar151,1);
      auVar151 = vmaxss_avx(auVar151,auVar12);
      auVar12 = vmovshdup_avx(auVar87);
      uVar83 = auVar12._0_8_;
      local_560._8_8_ = uVar83;
      local_560._0_8_ = uVar83;
      local_560._16_8_ = uVar83;
      local_560._24_8_ = uVar83;
      auVar12 = vmovshdup_avx(auVar86);
      uVar83 = auVar12._0_8_;
      local_460._8_8_ = uVar83;
      local_460._0_8_ = uVar83;
      local_460._16_8_ = uVar83;
      local_460._24_8_ = uVar83;
      auVar98 = *(undefined1 (*) [32])(bezier_basis0 + lVar21 + 0x908);
      auVar12 = vmovshdup_avx(auVar131);
      uVar83 = auVar12._0_8_;
      local_640._8_8_ = uVar83;
      local_640._0_8_ = uVar83;
      local_640._16_8_ = uVar83;
      local_640._24_8_ = uVar83;
      auVar12 = vmovshdup_avx(auVar111);
      local_5c0 = auVar12._0_8_;
      uVar109 = auVar131._0_4_;
      local_680._4_4_ = uVar109;
      local_680._0_4_ = uVar109;
      local_680._8_4_ = uVar109;
      local_680._12_4_ = uVar109;
      local_680._16_4_ = uVar109;
      local_680._20_4_ = uVar109;
      local_680._24_4_ = uVar109;
      local_680._28_4_ = uVar109;
      fVar104 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar21 + 0xd8c);
      fVar193 = *(float *)(bezier_basis0 + lVar21 + 0xd90);
      fVar194 = *(float *)(bezier_basis0 + lVar21 + 0xd94);
      fVar195 = *(float *)(bezier_basis0 + lVar21 + 0xd98);
      fVar156 = *(float *)(bezier_basis0 + lVar21 + 0xd9c);
      fVar82 = *(float *)(bezier_basis0 + lVar21 + 0xda0);
      fVar101 = *(float *)(bezier_basis0 + lVar21 + 0xda4);
      auVar73 = *(undefined1 (*) [28])(bezier_basis0 + lVar21 + 0xd8c);
      local_440 = auVar111._0_4_;
      auVar152._0_4_ = fVar104 * local_440;
      auVar152._4_4_ = fVar193 * local_440;
      auVar152._8_4_ = fVar194 * local_440;
      auVar152._12_4_ = fVar195 * local_440;
      auVar152._16_4_ = fVar156 * local_440;
      auVar152._20_4_ = fVar82 * local_440;
      auVar152._24_4_ = fVar101 * local_440;
      auVar152._28_4_ = 0;
      auVar13 = vfmadd231ps_fma(auVar152,auVar98,local_680);
      fVar129 = auVar12._0_4_;
      auVar142._0_4_ = fVar104 * fVar129;
      fVar102 = auVar12._4_4_;
      auVar142._4_4_ = fVar193 * fVar102;
      auVar142._8_4_ = fVar194 * fVar129;
      auVar142._12_4_ = fVar195 * fVar102;
      auVar142._16_4_ = fVar156 * fVar129;
      auVar142._20_4_ = fVar82 * fVar102;
      auVar142._24_4_ = fVar101 * fVar129;
      auVar142._28_4_ = 0;
      auVar12 = vfmadd231ps_fma(auVar142,auVar98,local_640);
      auVar142 = *(undefined1 (*) [32])(bezier_basis0 + lVar21 + 0x484);
      uVar179 = auVar86._0_4_;
      local_760._4_4_ = uVar179;
      local_760._0_4_ = uVar179;
      local_760._8_4_ = uVar179;
      local_760._12_4_ = uVar179;
      local_760._16_4_ = uVar179;
      local_760._20_4_ = uVar179;
      local_760._24_4_ = uVar179;
      local_760._28_4_ = uVar179;
      auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar142,local_760);
      auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar142,local_460);
      auVar152 = *(undefined1 (*) [32])(bezier_basis0 + lVar21);
      uVar179 = auVar87._0_4_;
      local_780._4_4_ = uVar179;
      local_780._0_4_ = uVar179;
      local_780._8_4_ = uVar179;
      local_780._12_4_ = uVar179;
      local_780._16_4_ = uVar179;
      local_780._20_4_ = uVar179;
      local_780._24_4_ = uVar179;
      local_780._28_4_ = uVar179;
      auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar152,local_780);
      auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar152,local_560);
      auVar97 = *(undefined1 (*) [32])(bezier_basis1 + lVar21 + 0x908);
      fVar103 = *(float *)(bezier_basis1 + lVar21 + 0xd8c);
      fVar105 = *(float *)(bezier_basis1 + lVar21 + 0xd90);
      fVar106 = *(float *)(bezier_basis1 + lVar21 + 0xd94);
      fVar107 = *(float *)(bezier_basis1 + lVar21 + 0xd98);
      fVar108 = *(float *)(bezier_basis1 + lVar21 + 0xd9c);
      fVar71 = *(float *)(bezier_basis1 + lVar21 + 0xda0);
      fVar72 = *(float *)(bezier_basis1 + lVar21 + 0xda4);
      auVar121._4_4_ = fVar105 * local_440;
      auVar121._0_4_ = fVar103 * local_440;
      auVar121._8_4_ = fVar106 * local_440;
      auVar121._12_4_ = fVar107 * local_440;
      auVar121._16_4_ = fVar108 * local_440;
      auVar121._20_4_ = fVar71 * local_440;
      auVar121._24_4_ = fVar72 * local_440;
      auVar121._28_4_ = local_440;
      auVar14 = vfmadd231ps_fma(auVar121,auVar97,local_680);
      auVar5._4_4_ = fVar105 * fVar102;
      auVar5._0_4_ = fVar103 * fVar129;
      auVar5._8_4_ = fVar106 * fVar129;
      auVar5._12_4_ = fVar107 * fVar102;
      auVar5._16_4_ = fVar108 * fVar129;
      auVar5._20_4_ = fVar71 * fVar102;
      auVar5._24_4_ = fVar72 * fVar129;
      auVar5._28_4_ = uVar109;
      auVar15 = vfmadd231ps_fma(auVar5,auVar97,local_640);
      auVar121 = *(undefined1 (*) [32])(bezier_basis1 + lVar21 + 0x484);
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar121,local_760);
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar121,local_460);
      auVar5 = *(undefined1 (*) [32])(bezier_basis1 + lVar21);
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar5,local_780);
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar5,local_560);
      auVar90 = ZEXT1632(auVar14);
      local_300 = ZEXT1632(auVar13);
      auVar17 = vsubps_avx(auVar90,local_300);
      auVar116 = ZEXT1632(auVar15);
      _local_4c0 = ZEXT1632(auVar12);
      auVar145 = vsubps_avx(auVar116,_local_4c0);
      auVar91._0_4_ = auVar12._0_4_ * auVar17._0_4_;
      auVar91._4_4_ = auVar12._4_4_ * auVar17._4_4_;
      auVar91._8_4_ = auVar12._8_4_ * auVar17._8_4_;
      auVar91._12_4_ = auVar12._12_4_ * auVar17._12_4_;
      auVar91._16_4_ = auVar17._16_4_ * 0.0;
      auVar91._20_4_ = auVar17._20_4_ * 0.0;
      auVar91._24_4_ = auVar17._24_4_ * 0.0;
      auVar91._28_4_ = 0;
      fVar204 = auVar145._0_4_;
      auVar117._0_4_ = fVar204 * auVar13._0_4_;
      fVar210 = auVar145._4_4_;
      auVar117._4_4_ = fVar210 * auVar13._4_4_;
      fVar216 = auVar145._8_4_;
      auVar117._8_4_ = fVar216 * auVar13._8_4_;
      fVar217 = auVar145._12_4_;
      auVar117._12_4_ = fVar217 * auVar13._12_4_;
      fVar218 = auVar145._16_4_;
      auVar117._16_4_ = fVar218 * 0.0;
      fVar219 = auVar145._20_4_;
      auVar117._20_4_ = fVar219 * 0.0;
      fVar220 = auVar145._24_4_;
      auVar117._24_4_ = fVar220 * 0.0;
      auVar117._28_4_ = 0;
      auVar91 = vsubps_avx(auVar91,auVar117);
      auVar174 = ZEXT3264(auVar91);
      auVar12 = vpermilps_avx(auVar85,0xff);
      uVar83 = auVar12._0_8_;
      local_80._8_8_ = uVar83;
      local_80._0_8_ = uVar83;
      local_80._16_8_ = uVar83;
      local_80._24_8_ = uVar83;
      auVar13 = vpermilps_avx(auVar16,0xff);
      local_a0._0_8_ = auVar13._0_8_;
      local_a0._8_8_ = local_a0._0_8_;
      local_a0._16_8_ = local_a0._0_8_;
      local_a0._24_8_ = local_a0._0_8_;
      auVar187._4_4_ = fVar193 * fVar130;
      auVar187._0_4_ = fVar104 * fVar130;
      auVar187._8_4_ = fVar194 * fVar130;
      auVar187._12_4_ = fVar195 * fVar130;
      auVar187._16_4_ = fVar156 * fVar130;
      auVar187._20_4_ = fVar82 * fVar130;
      auVar187._24_4_ = fVar101 * fVar130;
      auVar187._28_4_ = *(undefined4 *)(bezier_basis0 + lVar21 + 0xda8);
      auVar13 = vfmadd231ps_fma(auVar187,local_a0,auVar98);
      auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar142,local_80);
      auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar152,local_100);
      auVar191._4_4_ = fVar105 * fVar130;
      auVar191._0_4_ = fVar103 * fVar130;
      auVar191._8_4_ = fVar106 * fVar130;
      auVar191._12_4_ = fVar107 * fVar130;
      auVar191._16_4_ = fVar108 * fVar130;
      auVar191._20_4_ = fVar71 * fVar130;
      auVar191._24_4_ = fVar72 * fVar130;
      auVar191._28_4_ = auVar152._28_4_;
      auVar14 = vfmadd231ps_fma(auVar191,auVar97,local_a0);
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar121,local_80);
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar5,local_100);
      auVar20._4_4_ = fVar210 * fVar210;
      auVar20._0_4_ = fVar204 * fVar204;
      auVar20._8_4_ = fVar216 * fVar216;
      auVar20._12_4_ = fVar217 * fVar217;
      auVar20._16_4_ = fVar218 * fVar218;
      auVar20._20_4_ = fVar219 * fVar219;
      auVar20._24_4_ = fVar220 * fVar220;
      auVar20._28_4_ = auVar12._4_4_;
      auVar12 = vfmadd231ps_fma(auVar20,auVar17,auVar17);
      auVar187 = vmaxps_avx(ZEXT1632(auVar13),ZEXT1632(auVar14));
      auVar18._4_4_ = auVar187._4_4_ * auVar187._4_4_ * auVar12._4_4_;
      auVar18._0_4_ = auVar187._0_4_ * auVar187._0_4_ * auVar12._0_4_;
      auVar18._8_4_ = auVar187._8_4_ * auVar187._8_4_ * auVar12._8_4_;
      auVar18._12_4_ = auVar187._12_4_ * auVar187._12_4_ * auVar12._12_4_;
      auVar18._16_4_ = auVar187._16_4_ * auVar187._16_4_ * 0.0;
      auVar18._20_4_ = auVar187._20_4_ * auVar187._20_4_ * 0.0;
      auVar18._24_4_ = auVar187._24_4_ * auVar187._24_4_ * 0.0;
      auVar18._28_4_ = auVar187._28_4_;
      auVar19._4_4_ = auVar91._4_4_ * auVar91._4_4_;
      auVar19._0_4_ = auVar91._0_4_ * auVar91._0_4_;
      auVar19._8_4_ = auVar91._8_4_ * auVar91._8_4_;
      auVar19._12_4_ = auVar91._12_4_ * auVar91._12_4_;
      auVar19._16_4_ = auVar91._16_4_ * auVar91._16_4_;
      auVar19._20_4_ = auVar91._20_4_ * auVar91._20_4_;
      auVar19._24_4_ = auVar91._24_4_ * auVar91._24_4_;
      auVar19._28_4_ = 0;
      auVar187 = vcmpps_avx(auVar19,auVar18,2);
      fVar130 = auVar151._0_4_ * 4.7683716e-07;
      auVar92._0_4_ = (float)iVar9;
      register0x00001504 = auVar111._4_12_;
      auVar92._4_4_ = auVar92._0_4_;
      auVar92._8_4_ = auVar92._0_4_;
      auVar92._12_4_ = auVar92._0_4_;
      auVar92._16_4_ = auVar92._0_4_;
      auVar92._20_4_ = auVar92._0_4_;
      auVar92._24_4_ = auVar92._0_4_;
      auVar92._28_4_ = auVar92._0_4_;
      auVar191 = vcmpps_avx(_DAT_01faff40,auVar92,1);
      auVar151 = vpermilps_avx(auVar87,0xaa);
      uVar83 = auVar151._0_8_;
      auVar183._8_8_ = uVar83;
      auVar183._0_8_ = uVar83;
      auVar183._16_8_ = uVar83;
      auVar183._24_8_ = uVar83;
      auVar12 = vpermilps_avx(auVar86,0xaa);
      uVar83 = auVar12._0_8_;
      auVar198._8_8_ = uVar83;
      auVar198._0_8_ = uVar83;
      auVar198._16_8_ = uVar83;
      auVar198._24_8_ = uVar83;
      auVar151 = vpermilps_avx(auVar131,0xaa);
      uVar83 = auVar151._0_8_;
      local_2e0._8_8_ = uVar83;
      local_2e0._0_8_ = uVar83;
      local_2e0._16_8_ = uVar83;
      local_2e0._24_8_ = uVar83;
      auVar151 = vshufps_avx(auVar111,auVar111,0xaa);
      uVar83 = auVar151._0_8_;
      auVar206._8_8_ = uVar83;
      auVar206._0_8_ = uVar83;
      auVar206._16_8_ = uVar83;
      auVar206._24_8_ = uVar83;
      auVar209 = ZEXT3264(auVar206);
      auVar20 = auVar191 & auVar187;
      uVar78 = *(uint *)(ray + k * 4 + 0x30);
      local_6e0._0_16_ = ZEXT416(uVar78);
      local_7c0 = auVar85._0_8_;
      uStack_7b8 = auVar85._8_8_;
      local_7d0 = auVar16._0_8_;
      uStack_7c8 = auVar16._8_8_;
      fVar104 = fVar129;
      fVar193 = fVar102;
      fVar194 = fVar129;
      fVar195 = fVar102;
      fVar156 = fVar129;
      uStack_5b8 = local_5c0;
      uStack_5b0 = local_5c0;
      uStack_5a8 = local_5c0;
      fStack_43c = local_440;
      fStack_438 = local_440;
      fStack_434 = local_440;
      fStack_430 = local_440;
      fStack_42c = local_440;
      fStack_428 = local_440;
      fStack_424 = local_440;
      local_5d0._0_4_ = auVar92._0_4_;
      if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar20 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar20 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar20 >> 0x7f,0) == '\0') &&
            (auVar20 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar20 >> 0xbf,0) == '\0') &&
          (auVar20 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar20[0x1f])
      {
        auVar128 = ZEXT3264(local_640);
        auVar192 = ZEXT3264(local_680);
        auVar203 = ZEXT3264(local_760);
        auVar215 = ZEXT3264(local_780);
      }
      else {
        _local_320 = vandps_avx(auVar187,auVar191);
        fVar204 = auVar151._0_4_;
        fVar210 = auVar151._4_4_;
        auVar22._4_4_ = fVar210 * fVar105;
        auVar22._0_4_ = fVar204 * fVar103;
        auVar22._8_4_ = fVar204 * fVar106;
        auVar22._12_4_ = fVar210 * fVar107;
        auVar22._16_4_ = fVar204 * fVar108;
        auVar22._20_4_ = fVar210 * fVar71;
        auVar22._24_4_ = fVar204 * fVar72;
        auVar22._28_4_ = local_320._28_4_;
        auVar151 = vfmadd213ps_fma(auVar97,local_2e0,auVar22);
        auVar151 = vfmadd213ps_fma(auVar121,auVar198,ZEXT1632(auVar151));
        auVar151 = vfmadd213ps_fma(auVar5,auVar183,ZEXT1632(auVar151));
        local_620._0_4_ = auVar73._0_4_;
        local_620._4_4_ = auVar73._4_4_;
        fStack_618 = auVar73._8_4_;
        fStack_614 = auVar73._12_4_;
        fStack_610 = auVar73._16_4_;
        fStack_60c = auVar73._20_4_;
        fStack_608 = auVar73._24_4_;
        auVar93._0_4_ = fVar204 * (float)local_620._0_4_;
        auVar93._4_4_ = fVar210 * (float)local_620._4_4_;
        auVar93._8_4_ = fVar204 * fStack_618;
        auVar93._12_4_ = fVar210 * fStack_614;
        auVar93._16_4_ = fVar204 * fStack_610;
        auVar93._20_4_ = fVar210 * fStack_60c;
        auVar93._24_4_ = fVar204 * fStack_608;
        auVar93._28_4_ = 0;
        auVar15 = vfmadd213ps_fma(auVar98,local_2e0,auVar93);
        auVar15 = vfmadd213ps_fma(auVar142,auVar198,ZEXT1632(auVar15));
        auVar98 = *(undefined1 (*) [32])(bezier_basis0 + lVar21 + 0x1210);
        auVar142 = *(undefined1 (*) [32])(bezier_basis0 + lVar21 + 0x1694);
        auVar97 = *(undefined1 (*) [32])(bezier_basis0 + lVar21 + 0x1b18);
        fVar82 = *(float *)(bezier_basis0 + lVar21 + 0x1f9c);
        fVar101 = *(float *)(bezier_basis0 + lVar21 + 0x1fa0);
        fVar103 = *(float *)(bezier_basis0 + lVar21 + 0x1fa4);
        fVar105 = *(float *)(bezier_basis0 + lVar21 + 0x1fa8);
        fVar106 = *(float *)(bezier_basis0 + lVar21 + 0x1fac);
        fVar107 = *(float *)(bezier_basis0 + lVar21 + 0x1fb0);
        fVar108 = *(float *)(bezier_basis0 + lVar21 + 0x1fb4);
        auVar23._4_4_ = local_440 * fVar101;
        auVar23._0_4_ = local_440 * fVar82;
        auVar23._8_4_ = local_440 * fVar103;
        auVar23._12_4_ = local_440 * fVar105;
        auVar23._16_4_ = local_440 * fVar106;
        auVar23._20_4_ = local_440 * fVar107;
        auVar23._24_4_ = local_440 * fVar108;
        auVar23._28_4_ = auVar91._28_4_;
        auVar24._4_4_ = fVar101 * fVar102;
        auVar24._0_4_ = fVar82 * fVar129;
        auVar24._8_4_ = fVar103 * fVar129;
        auVar24._12_4_ = fVar105 * fVar102;
        auVar24._16_4_ = fVar106 * fVar129;
        auVar24._20_4_ = fVar107 * fVar102;
        auVar24._24_4_ = fVar108 * fVar129;
        auVar24._28_4_ = *(undefined4 *)(bezier_basis1 + lVar21 + 0xda8);
        auVar25._4_4_ = fVar101 * fVar210;
        auVar25._0_4_ = fVar82 * fVar204;
        auVar25._8_4_ = fVar103 * fVar204;
        auVar25._12_4_ = fVar105 * fVar210;
        auVar25._16_4_ = fVar106 * fVar204;
        auVar25._20_4_ = fVar107 * fVar210;
        auVar25._24_4_ = fVar108 * fVar204;
        auVar25._28_4_ = auVar12._4_4_;
        auVar12 = vfmadd231ps_fma(auVar23,auVar97,local_680);
        auVar87 = vfmadd231ps_fma(auVar24,auVar97,local_640);
        auVar86 = vfmadd231ps_fma(auVar25,local_2e0,auVar97);
        auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar142,local_760);
        auVar87 = vfmadd231ps_fma(ZEXT1632(auVar87),auVar142,local_460);
        auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar198,auVar142);
        auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar98,local_780);
        auVar87 = vfmadd231ps_fma(ZEXT1632(auVar87),auVar98,local_560);
        auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar98,auVar183);
        fVar82 = *(float *)(bezier_basis1 + lVar21 + 0x1f9c);
        fVar101 = *(float *)(bezier_basis1 + lVar21 + 0x1fa0);
        fVar103 = *(float *)(bezier_basis1 + lVar21 + 0x1fa4);
        fVar105 = *(float *)(bezier_basis1 + lVar21 + 0x1fa8);
        fVar106 = *(float *)(bezier_basis1 + lVar21 + 0x1fac);
        fVar107 = *(float *)(bezier_basis1 + lVar21 + 0x1fb0);
        fVar108 = *(float *)(bezier_basis1 + lVar21 + 0x1fb4);
        auVar200._0_4_ = local_440 * fVar82;
        auVar200._4_4_ = local_440 * fVar101;
        auVar200._8_4_ = local_440 * fVar103;
        auVar200._12_4_ = local_440 * fVar105;
        auVar200._16_4_ = local_440 * fVar106;
        auVar200._20_4_ = local_440 * fVar107;
        auVar200._24_4_ = local_440 * fVar108;
        auVar200._28_4_ = 0;
        auVar97._4_4_ = fVar102 * fVar101;
        auVar97._0_4_ = fVar129 * fVar82;
        auVar97._8_4_ = fVar129 * fVar103;
        auVar97._12_4_ = fVar102 * fVar105;
        auVar97._16_4_ = fVar129 * fVar106;
        auVar97._20_4_ = fVar102 * fVar107;
        auVar97._24_4_ = fVar129 * fVar108;
        auVar97._28_4_ = local_440;
        auVar26._4_4_ = fVar210 * fVar101;
        auVar26._0_4_ = fVar204 * fVar82;
        auVar26._8_4_ = fVar204 * fVar103;
        auVar26._12_4_ = fVar210 * fVar105;
        auVar26._16_4_ = fVar204 * fVar106;
        auVar26._20_4_ = fVar210 * fVar107;
        auVar26._24_4_ = fVar204 * fVar108;
        auVar26._28_4_ = fVar210;
        auVar98 = *(undefined1 (*) [32])(bezier_basis1 + lVar21 + 0x1b18);
        auVar131 = vfmadd231ps_fma(auVar200,auVar98,local_680);
        auVar111 = vfmadd231ps_fma(auVar97,auVar98,local_640);
        auVar112 = vfmadd231ps_fma(auVar26,local_2e0,auVar98);
        auVar98 = *(undefined1 (*) [32])(bezier_basis1 + lVar21 + 0x1694);
        auVar131 = vfmadd231ps_fma(ZEXT1632(auVar131),auVar98,local_760);
        auVar111 = vfmadd231ps_fma(ZEXT1632(auVar111),auVar98,local_460);
        auVar112 = vfmadd231ps_fma(ZEXT1632(auVar112),auVar98,auVar198);
        auVar98 = *(undefined1 (*) [32])(bezier_basis1 + lVar21 + 0x1210);
        auVar131 = vfmadd231ps_fma(ZEXT1632(auVar131),auVar98,local_780);
        auVar111 = vfmadd231ps_fma(ZEXT1632(auVar111),auVar98,local_560);
        auVar118._8_4_ = 0x7fffffff;
        auVar118._0_8_ = 0x7fffffff7fffffff;
        auVar118._12_4_ = 0x7fffffff;
        auVar118._16_4_ = 0x7fffffff;
        auVar118._20_4_ = 0x7fffffff;
        auVar118._24_4_ = 0x7fffffff;
        auVar118._28_4_ = 0x7fffffff;
        auVar112 = vfmadd231ps_fma(ZEXT1632(auVar112),auVar183,auVar98);
        auVar98 = vandps_avx(ZEXT1632(auVar12),auVar118);
        auVar142 = vandps_avx(ZEXT1632(auVar87),auVar118);
        auVar142 = vmaxps_avx(auVar98,auVar142);
        auVar98 = vandps_avx(ZEXT1632(auVar86),auVar118);
        auVar98 = vmaxps_avx(auVar142,auVar98);
        auVar143._4_4_ = fVar130;
        auVar143._0_4_ = fVar130;
        auVar143._8_4_ = fVar130;
        auVar143._12_4_ = fVar130;
        auVar143._16_4_ = fVar130;
        auVar143._20_4_ = fVar130;
        auVar143._24_4_ = fVar130;
        auVar143._28_4_ = fVar130;
        auVar98 = vcmpps_avx(auVar98,auVar143,1);
        auVar97 = vblendvps_avx(ZEXT1632(auVar12),auVar17,auVar98);
        auVar121 = vblendvps_avx(ZEXT1632(auVar87),auVar145,auVar98);
        auVar98 = vandps_avx(ZEXT1632(auVar131),auVar118);
        auVar142 = vandps_avx(ZEXT1632(auVar111),auVar118);
        auVar142 = vmaxps_avx(auVar98,auVar142);
        auVar98 = vandps_avx(ZEXT1632(auVar112),auVar118);
        auVar98 = vmaxps_avx(auVar142,auVar98);
        auVar5 = vcmpps_avx(auVar98,auVar143,1);
        auVar98 = vblendvps_avx(ZEXT1632(auVar131),auVar17,auVar5);
        auVar142 = vblendvps_avx(ZEXT1632(auVar111),auVar145,auVar5);
        auVar12 = vfmadd213ps_fma(auVar152,auVar183,ZEXT1632(auVar15));
        auVar15 = vfmadd213ps_fma(auVar97,auVar97,ZEXT832(0) << 0x20);
        auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar121,auVar121);
        auVar152 = vrsqrtps_avx(ZEXT1632(auVar15));
        fVar82 = auVar152._0_4_;
        fVar101 = auVar152._4_4_;
        fVar103 = auVar152._8_4_;
        fVar105 = auVar152._12_4_;
        fVar106 = auVar152._16_4_;
        fVar107 = auVar152._20_4_;
        fVar108 = auVar152._24_4_;
        auVar17._4_4_ = fVar101 * fVar101 * fVar101 * auVar15._4_4_ * -0.5;
        auVar17._0_4_ = fVar82 * fVar82 * fVar82 * auVar15._0_4_ * -0.5;
        auVar17._8_4_ = fVar103 * fVar103 * fVar103 * auVar15._8_4_ * -0.5;
        auVar17._12_4_ = fVar105 * fVar105 * fVar105 * auVar15._12_4_ * -0.5;
        auVar17._16_4_ = fVar106 * fVar106 * fVar106 * -0.0;
        auVar17._20_4_ = fVar107 * fVar107 * fVar107 * -0.0;
        auVar17._24_4_ = fVar108 * fVar108 * fVar108 * -0.0;
        auVar17._28_4_ = 0;
        auVar201._8_4_ = 0x3fc00000;
        auVar201._0_8_ = 0x3fc000003fc00000;
        auVar201._12_4_ = 0x3fc00000;
        auVar201._16_4_ = 0x3fc00000;
        auVar201._20_4_ = 0x3fc00000;
        auVar201._24_4_ = 0x3fc00000;
        auVar201._28_4_ = 0x3fc00000;
        auVar15 = vfmadd231ps_fma(auVar17,auVar201,auVar152);
        fVar82 = auVar15._0_4_;
        fVar101 = auVar15._4_4_;
        auVar145._4_4_ = auVar121._4_4_ * fVar101;
        auVar145._0_4_ = auVar121._0_4_ * fVar82;
        fVar103 = auVar15._8_4_;
        auVar145._8_4_ = auVar121._8_4_ * fVar103;
        fVar105 = auVar15._12_4_;
        auVar145._12_4_ = auVar121._12_4_ * fVar105;
        auVar145._16_4_ = auVar121._16_4_ * 0.0;
        auVar145._20_4_ = auVar121._20_4_ * 0.0;
        auVar145._24_4_ = auVar121._24_4_ * 0.0;
        auVar145._28_4_ = auVar152._28_4_;
        auVar27._4_4_ = -auVar97._4_4_ * fVar101;
        auVar27._0_4_ = -auVar97._0_4_ * fVar82;
        auVar27._8_4_ = -auVar97._8_4_ * fVar103;
        auVar27._12_4_ = -auVar97._12_4_ * fVar105;
        auVar27._16_4_ = -auVar97._16_4_ * 0.0;
        auVar27._20_4_ = -auVar97._20_4_ * 0.0;
        auVar27._24_4_ = -auVar97._24_4_ * 0.0;
        auVar27._28_4_ = 0x80000000;
        auVar15 = vfmadd213ps_fma(auVar98,auVar98,ZEXT832(0) << 0x20);
        auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar142,auVar142);
        auVar152 = vrsqrtps_avx(ZEXT1632(auVar15));
        auVar28._28_4_ = auVar5._28_4_;
        auVar28._0_28_ =
             ZEXT1628(CONCAT412(fVar105 * 0.0,
                                CONCAT48(fVar103 * 0.0,CONCAT44(fVar101 * 0.0,fVar82 * 0.0))));
        fVar82 = auVar152._0_4_;
        fVar101 = auVar152._4_4_;
        fVar103 = auVar152._8_4_;
        fVar105 = auVar152._12_4_;
        fVar106 = auVar152._16_4_;
        fVar107 = auVar152._20_4_;
        fVar108 = auVar152._24_4_;
        auVar29._4_4_ = fVar101 * fVar101 * fVar101 * auVar15._4_4_ * -0.5;
        auVar29._0_4_ = fVar82 * fVar82 * fVar82 * auVar15._0_4_ * -0.5;
        auVar29._8_4_ = fVar103 * fVar103 * fVar103 * auVar15._8_4_ * -0.5;
        auVar29._12_4_ = fVar105 * fVar105 * fVar105 * auVar15._12_4_ * -0.5;
        auVar29._16_4_ = fVar106 * fVar106 * fVar106 * -0.0;
        auVar29._20_4_ = fVar107 * fVar107 * fVar107 * -0.0;
        auVar29._24_4_ = fVar108 * fVar108 * fVar108 * -0.0;
        auVar29._28_4_ = 0;
        auVar15 = vfmadd231ps_fma(auVar29,auVar201,auVar152);
        fVar82 = auVar15._0_4_;
        fVar101 = auVar15._4_4_;
        auVar30._4_4_ = auVar142._4_4_ * fVar101;
        auVar30._0_4_ = auVar142._0_4_ * fVar82;
        fVar103 = auVar15._8_4_;
        auVar30._8_4_ = auVar142._8_4_ * fVar103;
        fVar105 = auVar15._12_4_;
        auVar30._12_4_ = auVar142._12_4_ * fVar105;
        auVar30._16_4_ = auVar142._16_4_ * 0.0;
        auVar30._20_4_ = auVar142._20_4_ * 0.0;
        auVar30._24_4_ = auVar142._24_4_ * 0.0;
        auVar30._28_4_ = auVar142._28_4_;
        auVar31._4_4_ = fVar101 * -auVar98._4_4_;
        auVar31._0_4_ = fVar82 * -auVar98._0_4_;
        auVar31._8_4_ = fVar103 * -auVar98._8_4_;
        auVar31._12_4_ = fVar105 * -auVar98._12_4_;
        auVar31._16_4_ = -auVar98._16_4_ * 0.0;
        auVar31._20_4_ = -auVar98._20_4_ * 0.0;
        auVar31._24_4_ = -auVar98._24_4_ * 0.0;
        auVar31._28_4_ = auVar97._28_4_ ^ 0x80000000;
        auVar98._28_4_ = auVar152._28_4_;
        auVar98._0_28_ =
             ZEXT1628(CONCAT412(fVar105 * 0.0,
                                CONCAT48(fVar103 * 0.0,CONCAT44(fVar101 * 0.0,fVar82 * 0.0))));
        auVar15 = vfmadd213ps_fma(auVar145,ZEXT1632(auVar13),local_300);
        local_4e0 = ZEXT1632(auVar15);
        auVar142 = ZEXT1632(auVar13);
        auVar15 = vfmadd213ps_fma(auVar27,auVar142,_local_4c0);
        local_500 = ZEXT1632(auVar15);
        auVar15 = vfmadd213ps_fma(auVar28,auVar142,ZEXT1632(auVar12));
        local_340 = ZEXT1632(auVar15);
        auVar131 = vfnmadd213ps_fma(auVar145,auVar142,local_300);
        auVar87 = vfmadd213ps_fma(auVar30,ZEXT1632(auVar14),auVar90);
        auVar111 = vfnmadd213ps_fma(auVar27,auVar142,_local_4c0);
        auVar142 = ZEXT1632(auVar14);
        auVar86 = vfmadd213ps_fma(auVar31,auVar142,auVar116);
        auVar117 = ZEXT1632(auVar13);
        auVar158 = vfnmadd231ps_fma(ZEXT1632(auVar12),auVar117,auVar28);
        auVar12 = vfmadd213ps_fma(auVar98,auVar142,ZEXT1632(auVar151));
        auVar112 = vfnmadd213ps_fma(auVar30,auVar142,auVar90);
        auVar147 = vfnmadd213ps_fma(auVar31,auVar142,auVar116);
        auVar84 = vfnmadd231ps_fma(ZEXT1632(auVar151),ZEXT1632(auVar14),auVar98);
        auVar98 = vsubps_avx(ZEXT1632(auVar86),ZEXT1632(auVar111));
        auVar142 = vsubps_avx(ZEXT1632(auVar12),ZEXT1632(auVar158));
        auVar90._4_4_ = auVar158._4_4_ * auVar98._4_4_;
        auVar90._0_4_ = auVar158._0_4_ * auVar98._0_4_;
        auVar90._8_4_ = auVar158._8_4_ * auVar98._8_4_;
        auVar90._12_4_ = auVar158._12_4_ * auVar98._12_4_;
        auVar90._16_4_ = auVar98._16_4_ * 0.0;
        auVar90._20_4_ = auVar98._20_4_ * 0.0;
        auVar90._24_4_ = auVar98._24_4_ * 0.0;
        auVar90._28_4_ = 0;
        auVar13 = vfmsub231ps_fma(auVar90,ZEXT1632(auVar111),auVar142);
        auVar116._4_4_ = auVar131._4_4_ * auVar142._4_4_;
        auVar116._0_4_ = auVar131._0_4_ * auVar142._0_4_;
        auVar116._8_4_ = auVar131._8_4_ * auVar142._8_4_;
        auVar116._12_4_ = auVar131._12_4_ * auVar142._12_4_;
        auVar116._16_4_ = auVar142._16_4_ * 0.0;
        auVar116._20_4_ = auVar142._20_4_ * 0.0;
        auVar116._24_4_ = auVar142._24_4_ * 0.0;
        auVar116._28_4_ = auVar142._28_4_;
        auVar187 = ZEXT1632(auVar131);
        auVar142 = vsubps_avx(ZEXT1632(auVar87),auVar187);
        auVar151 = vfmsub231ps_fma(auVar116,ZEXT1632(auVar158),auVar142);
        auVar32._4_4_ = auVar111._4_4_ * auVar142._4_4_;
        auVar32._0_4_ = auVar111._0_4_ * auVar142._0_4_;
        auVar32._8_4_ = auVar111._8_4_ * auVar142._8_4_;
        auVar32._12_4_ = auVar111._12_4_ * auVar142._12_4_;
        auVar32._16_4_ = auVar142._16_4_ * 0.0;
        auVar32._20_4_ = auVar142._20_4_ * 0.0;
        auVar32._24_4_ = auVar142._24_4_ * 0.0;
        auVar32._28_4_ = auVar142._28_4_;
        auVar131 = vfmsub231ps_fma(auVar32,auVar187,auVar98);
        auVar98 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar151 = vfmadd231ps_fma(ZEXT1632(auVar131),auVar98,ZEXT1632(auVar151));
        auVar151 = vfmadd231ps_fma(ZEXT1632(auVar151),auVar98,ZEXT1632(auVar13));
        auVar145 = vcmpps_avx(ZEXT1632(auVar151),ZEXT1232(ZEXT812(0)) << 0x20,2);
        auVar98 = vblendvps_avx(ZEXT1632(auVar112),local_4e0,auVar145);
        auVar142 = vblendvps_avx(ZEXT1632(auVar147),local_500,auVar145);
        auVar152 = vblendvps_avx(ZEXT1632(auVar84),ZEXT1632(auVar15),auVar145);
        auVar97 = vblendvps_avx(auVar187,ZEXT1632(auVar87),auVar145);
        auVar121 = vblendvps_avx(ZEXT1632(auVar111),ZEXT1632(auVar86),auVar145);
        auVar5 = vblendvps_avx(ZEXT1632(auVar158),ZEXT1632(auVar12),auVar145);
        auVar187 = vblendvps_avx(ZEXT1632(auVar87),auVar187,auVar145);
        auVar191 = vblendvps_avx(ZEXT1632(auVar86),ZEXT1632(auVar111),auVar145);
        auVar151 = vpackssdw_avx(local_320._0_16_,local_320._16_16_);
        auVar174 = ZEXT1664(auVar151);
        auVar17 = vblendvps_avx(ZEXT1632(auVar12),ZEXT1632(auVar158),auVar145);
        auVar91 = vsubps_avx(auVar187,auVar98);
        auVar191 = vsubps_avx(auVar191,auVar142);
        auVar20 = vsubps_avx(auVar17,auVar152);
        auVar18 = vsubps_avx(auVar98,auVar97);
        auVar19 = vsubps_avx(auVar142,auVar121);
        auVar90 = vsubps_avx(auVar152,auVar5);
        auVar33._4_4_ = auVar20._4_4_ * auVar98._4_4_;
        auVar33._0_4_ = auVar20._0_4_ * auVar98._0_4_;
        auVar33._8_4_ = auVar20._8_4_ * auVar98._8_4_;
        auVar33._12_4_ = auVar20._12_4_ * auVar98._12_4_;
        auVar33._16_4_ = auVar20._16_4_ * auVar98._16_4_;
        auVar33._20_4_ = auVar20._20_4_ * auVar98._20_4_;
        auVar33._24_4_ = auVar20._24_4_ * auVar98._24_4_;
        auVar33._28_4_ = auVar17._28_4_;
        auVar12 = vfmsub231ps_fma(auVar33,auVar152,auVar91);
        auVar34._4_4_ = auVar91._4_4_ * auVar142._4_4_;
        auVar34._0_4_ = auVar91._0_4_ * auVar142._0_4_;
        auVar34._8_4_ = auVar91._8_4_ * auVar142._8_4_;
        auVar34._12_4_ = auVar91._12_4_ * auVar142._12_4_;
        auVar34._16_4_ = auVar91._16_4_ * auVar142._16_4_;
        auVar34._20_4_ = auVar91._20_4_ * auVar142._20_4_;
        auVar34._24_4_ = auVar91._24_4_ * auVar142._24_4_;
        auVar34._28_4_ = auVar187._28_4_;
        auVar13 = vfmsub231ps_fma(auVar34,auVar98,auVar191);
        auVar12 = vfmadd231ps_fma(ZEXT1632(auVar13),ZEXT832(0) << 0x20,ZEXT1632(auVar12));
        auVar94._0_4_ = auVar191._0_4_ * auVar152._0_4_;
        auVar94._4_4_ = auVar191._4_4_ * auVar152._4_4_;
        auVar94._8_4_ = auVar191._8_4_ * auVar152._8_4_;
        auVar94._12_4_ = auVar191._12_4_ * auVar152._12_4_;
        auVar94._16_4_ = auVar191._16_4_ * auVar152._16_4_;
        auVar94._20_4_ = auVar191._20_4_ * auVar152._20_4_;
        auVar94._24_4_ = auVar191._24_4_ * auVar152._24_4_;
        auVar94._28_4_ = 0;
        auVar13 = vfmsub231ps_fma(auVar94,auVar142,auVar20);
        auVar13 = vfmadd231ps_fma(ZEXT1632(auVar12),ZEXT832(0) << 0x20,ZEXT1632(auVar13));
        auVar95._0_4_ = auVar90._0_4_ * auVar97._0_4_;
        auVar95._4_4_ = auVar90._4_4_ * auVar97._4_4_;
        auVar95._8_4_ = auVar90._8_4_ * auVar97._8_4_;
        auVar95._12_4_ = auVar90._12_4_ * auVar97._12_4_;
        auVar95._16_4_ = auVar90._16_4_ * auVar97._16_4_;
        auVar95._20_4_ = auVar90._20_4_ * auVar97._20_4_;
        auVar95._24_4_ = auVar90._24_4_ * auVar97._24_4_;
        auVar95._28_4_ = 0;
        auVar12 = vfmsub231ps_fma(auVar95,auVar18,auVar5);
        auVar35._4_4_ = auVar19._4_4_ * auVar5._4_4_;
        auVar35._0_4_ = auVar19._0_4_ * auVar5._0_4_;
        auVar35._8_4_ = auVar19._8_4_ * auVar5._8_4_;
        auVar35._12_4_ = auVar19._12_4_ * auVar5._12_4_;
        auVar35._16_4_ = auVar19._16_4_ * auVar5._16_4_;
        auVar35._20_4_ = auVar19._20_4_ * auVar5._20_4_;
        auVar35._24_4_ = auVar19._24_4_ * auVar5._24_4_;
        auVar35._28_4_ = auVar5._28_4_;
        auVar15 = vfmsub231ps_fma(auVar35,auVar121,auVar90);
        auVar36._4_4_ = auVar18._4_4_ * auVar121._4_4_;
        auVar36._0_4_ = auVar18._0_4_ * auVar121._0_4_;
        auVar36._8_4_ = auVar18._8_4_ * auVar121._8_4_;
        auVar36._12_4_ = auVar18._12_4_ * auVar121._12_4_;
        auVar36._16_4_ = auVar18._16_4_ * auVar121._16_4_;
        auVar36._20_4_ = auVar18._20_4_ * auVar121._20_4_;
        auVar36._24_4_ = auVar18._24_4_ * auVar121._24_4_;
        auVar36._28_4_ = auVar121._28_4_;
        auVar87 = vfmsub231ps_fma(auVar36,auVar19,auVar97);
        auVar12 = vfmadd231ps_fma(ZEXT1632(auVar87),ZEXT832(0) << 0x20,ZEXT1632(auVar12));
        auVar15 = vfmadd231ps_fma(ZEXT1632(auVar12),ZEXT832(0) << 0x20,ZEXT1632(auVar15));
        auVar97 = vmaxps_avx(ZEXT1632(auVar13),ZEXT1632(auVar15));
        auVar97 = vcmpps_avx(auVar97,ZEXT832(0) << 0x20,2);
        auVar12 = vpackssdw_avx(auVar97._0_16_,auVar97._16_16_);
        auVar151 = vpand_avx(auVar12,auVar151);
        auVar97 = vpmovsxwd_avx2(auVar151);
        if ((((((((auVar97 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar97 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar97 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar97 >> 0x7f,0) == '\0') &&
              (auVar97 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar97 >> 0xbf,0) == '\0') &&
            (auVar97 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar97[0x1f]) {
LAB_015ef1d7:
          auVar162._8_8_ = local_5a0[1]._8_8_;
          auVar162._0_8_ = local_5a0[1]._0_8_;
          auVar162._16_8_ = local_5a0[1]._16_8_;
          auVar162._24_8_ = local_5a0[1]._24_8_;
        }
        else {
          auVar37._4_4_ = auVar191._4_4_ * auVar90._4_4_;
          auVar37._0_4_ = auVar191._0_4_ * auVar90._0_4_;
          auVar37._8_4_ = auVar191._8_4_ * auVar90._8_4_;
          auVar37._12_4_ = auVar191._12_4_ * auVar90._12_4_;
          auVar37._16_4_ = auVar191._16_4_ * auVar90._16_4_;
          auVar37._20_4_ = auVar191._20_4_ * auVar90._20_4_;
          auVar37._24_4_ = auVar191._24_4_ * auVar90._24_4_;
          auVar37._28_4_ = auVar97._28_4_;
          auVar131 = vfmsub231ps_fma(auVar37,auVar19,auVar20);
          auVar119._0_4_ = auVar18._0_4_ * auVar20._0_4_;
          auVar119._4_4_ = auVar18._4_4_ * auVar20._4_4_;
          auVar119._8_4_ = auVar18._8_4_ * auVar20._8_4_;
          auVar119._12_4_ = auVar18._12_4_ * auVar20._12_4_;
          auVar119._16_4_ = auVar18._16_4_ * auVar20._16_4_;
          auVar119._20_4_ = auVar18._20_4_ * auVar20._20_4_;
          auVar119._24_4_ = auVar18._24_4_ * auVar20._24_4_;
          auVar119._28_4_ = 0;
          auVar86 = vfmsub231ps_fma(auVar119,auVar91,auVar90);
          auVar38._4_4_ = auVar91._4_4_ * auVar19._4_4_;
          auVar38._0_4_ = auVar91._0_4_ * auVar19._0_4_;
          auVar38._8_4_ = auVar91._8_4_ * auVar19._8_4_;
          auVar38._12_4_ = auVar91._12_4_ * auVar19._12_4_;
          auVar38._16_4_ = auVar91._16_4_ * auVar19._16_4_;
          auVar38._20_4_ = auVar91._20_4_ * auVar19._20_4_;
          auVar38._24_4_ = auVar91._24_4_ * auVar19._24_4_;
          auVar38._28_4_ = auVar91._28_4_;
          auVar111 = vfmsub231ps_fma(auVar38,auVar18,auVar191);
          auVar12 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar86),ZEXT1632(auVar111));
          auVar87 = vfmadd231ps_fma(ZEXT1632(auVar12),ZEXT1632(auVar131),_DAT_01faff00);
          auVar97 = vrcpps_avx(ZEXT1632(auVar87));
          auVar202._8_4_ = 0x3f800000;
          auVar202._0_8_ = 0x3f8000003f800000;
          auVar202._12_4_ = 0x3f800000;
          auVar202._16_4_ = 0x3f800000;
          auVar202._20_4_ = 0x3f800000;
          auVar202._24_4_ = 0x3f800000;
          auVar202._28_4_ = 0x3f800000;
          auVar12 = vfnmadd213ps_fma(auVar97,ZEXT1632(auVar87),auVar202);
          auVar12 = vfmadd132ps_fma(ZEXT1632(auVar12),auVar97,auVar97);
          auVar170._0_4_ = auVar152._0_4_ * auVar111._0_4_;
          auVar170._4_4_ = auVar152._4_4_ * auVar111._4_4_;
          auVar170._8_4_ = auVar152._8_4_ * auVar111._8_4_;
          auVar170._12_4_ = auVar152._12_4_ * auVar111._12_4_;
          auVar170._16_4_ = auVar152._16_4_ * 0.0;
          auVar170._20_4_ = auVar152._20_4_ * 0.0;
          auVar170._24_4_ = auVar152._24_4_ * 0.0;
          auVar170._28_4_ = 0;
          auVar86 = vfmadd231ps_fma(auVar170,auVar142,ZEXT1632(auVar86));
          auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),ZEXT1632(auVar131),auVar98);
          fVar82 = auVar12._0_4_;
          fVar101 = auVar12._4_4_;
          fVar103 = auVar12._8_4_;
          fVar105 = auVar12._12_4_;
          auVar152 = ZEXT1632(CONCAT412(fVar105 * auVar86._12_4_,
                                        CONCAT48(fVar103 * auVar86._8_4_,
                                                 CONCAT44(fVar101 * auVar86._4_4_,
                                                          fVar82 * auVar86._0_4_))));
          auVar174 = ZEXT3264(auVar152);
          auVar96._4_4_ = uVar78;
          auVar96._0_4_ = uVar78;
          auVar96._8_4_ = uVar78;
          auVar96._12_4_ = uVar78;
          auVar96._16_4_ = uVar78;
          auVar96._20_4_ = uVar78;
          auVar96._24_4_ = uVar78;
          auVar96._28_4_ = uVar78;
          uVar109 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar120._4_4_ = uVar109;
          auVar120._0_4_ = uVar109;
          auVar120._8_4_ = uVar109;
          auVar120._12_4_ = uVar109;
          auVar120._16_4_ = uVar109;
          auVar120._20_4_ = uVar109;
          auVar120._24_4_ = uVar109;
          auVar120._28_4_ = uVar109;
          auVar98 = vcmpps_avx(auVar96,auVar152,2);
          auVar142 = vcmpps_avx(auVar152,auVar120,2);
          auVar98 = vandps_avx(auVar142,auVar98);
          auVar12 = vpackssdw_avx(auVar98._0_16_,auVar98._16_16_);
          auVar151 = vpand_avx(auVar151,auVar12);
          auVar98 = vpmovsxwd_avx2(auVar151);
          if ((((((((auVar98 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar98 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar98 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar98 >> 0x7f,0) == '\0') &&
                (auVar98 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar98 >> 0xbf,0) == '\0') &&
              (auVar98 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar98[0x1f]) goto LAB_015ef1d7;
          auVar98 = vcmpps_avx(ZEXT1632(auVar87),ZEXT832(0) << 0x20,4);
          auVar12 = vpackssdw_avx(auVar98._0_16_,auVar98._16_16_);
          auVar151 = vpand_avx(auVar151,auVar12);
          auVar98 = vpmovsxwd_avx2(auVar151);
          auVar162._8_8_ = local_5a0[1]._8_8_;
          auVar162._0_8_ = local_5a0[1]._0_8_;
          auVar162._16_8_ = local_5a0[1]._16_8_;
          auVar162._24_8_ = local_5a0[1]._24_8_;
          if ((((((((auVar98 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar98 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar98 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar98 >> 0x7f,0) != '\0') ||
                (auVar98 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar98 >> 0xbf,0) != '\0') ||
              (auVar98 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar98[0x1f] < '\0') {
            auVar97 = ZEXT1632(CONCAT412(fVar105 * auVar13._12_4_,
                                         CONCAT48(fVar103 * auVar13._8_4_,
                                                  CONCAT44(fVar101 * auVar13._4_4_,
                                                           fVar82 * auVar13._0_4_))));
            auVar121 = ZEXT1632(CONCAT412(fVar105 * auVar15._12_4_,
                                          CONCAT48(fVar103 * auVar15._8_4_,
                                                   CONCAT44(fVar101 * auVar15._4_4_,
                                                            fVar82 * auVar15._0_4_))));
            auVar161._8_4_ = 0x3f800000;
            auVar161._0_8_ = 0x3f8000003f800000;
            auVar161._12_4_ = 0x3f800000;
            auVar161._16_4_ = 0x3f800000;
            auVar161._20_4_ = 0x3f800000;
            auVar161._24_4_ = 0x3f800000;
            auVar161._28_4_ = 0x3f800000;
            auVar142 = vsubps_avx(auVar161,auVar97);
            _local_140 = vblendvps_avx(auVar142,auVar97,auVar145);
            auVar142 = vsubps_avx(auVar161,auVar121);
            local_360 = vblendvps_avx(auVar142,auVar121,auVar145);
            auVar162 = auVar98;
            local_520 = auVar152;
          }
        }
        auVar215 = ZEXT3264(local_780);
        auVar209 = ZEXT3264(auVar206);
        auVar203 = ZEXT3264(local_760);
        auVar128 = ZEXT3264(auVar198);
        auVar192 = ZEXT3264(local_680);
        if ((((((((auVar162 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar162 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar162 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar162 >> 0x7f,0) != '\0') ||
              (auVar162 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar162 >> 0xbf,0) != '\0') ||
            (auVar162 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar162[0x1f] < '\0') {
          auVar98 = vsubps_avx(ZEXT1632(auVar14),auVar117);
          auVar151 = vfmadd213ps_fma(auVar98,_local_140,auVar117);
          fVar82 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
          auVar39._4_4_ = (auVar151._4_4_ + auVar151._4_4_) * fVar82;
          auVar39._0_4_ = (auVar151._0_4_ + auVar151._0_4_) * fVar82;
          auVar39._8_4_ = (auVar151._8_4_ + auVar151._8_4_) * fVar82;
          auVar39._12_4_ = (auVar151._12_4_ + auVar151._12_4_) * fVar82;
          auVar39._16_4_ = fVar82 * 0.0;
          auVar39._20_4_ = fVar82 * 0.0;
          auVar39._24_4_ = fVar82 * 0.0;
          auVar39._28_4_ = 0;
          auVar98 = vcmpps_avx(local_520,auVar39,6);
          auVar142 = auVar162 & auVar98;
          auVar185 = ZEXT3264(auVar183);
          if ((((((((auVar142 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar142 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar142 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar142 >> 0x7f,0) == '\0') &&
                (auVar142 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar142 >> 0xbf,0) == '\0') &&
              (auVar142 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar142[0x1f]) {
            auVar128 = ZEXT3264(local_640);
            goto LAB_015edf67;
          }
          auVar122._8_4_ = 0xbf800000;
          auVar122._0_8_ = 0xbf800000bf800000;
          auVar122._12_4_ = 0xbf800000;
          auVar122._16_4_ = 0xbf800000;
          auVar122._20_4_ = 0xbf800000;
          auVar122._24_4_ = 0xbf800000;
          auVar122._28_4_ = 0xbf800000;
          auVar144._8_4_ = 0x40000000;
          auVar144._0_8_ = 0x4000000040000000;
          auVar144._12_4_ = 0x40000000;
          auVar144._16_4_ = 0x40000000;
          auVar144._20_4_ = 0x40000000;
          auVar144._24_4_ = 0x40000000;
          auVar144._28_4_ = 0x40000000;
          auVar151 = vfmadd213ps_fma(local_360,auVar144,auVar122);
          auVar174 = ZEXT1664(auVar151);
          local_280 = _local_140;
          local_360 = ZEXT1632(auVar151);
          auVar142 = local_360;
          local_260 = ZEXT1632(auVar151);
          local_240 = local_520;
          local_220 = 0;
          local_21c = iVar9;
          local_210 = local_720._0_8_;
          uStack_208 = local_720._8_8_;
          local_200 = local_7c0;
          uStack_1f8 = uStack_7b8;
          local_1f0 = local_7d0;
          uStack_1e8 = uStack_7c8;
          local_1e0 = local_730;
          uStack_1d8 = uStack_728;
          local_360 = auVar142;
          if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
            local_5a0[0] = vandps_avx(auVar98,auVar162);
            fVar129 = 1.0 / auVar92._0_4_;
            local_1a0[0] = fVar129 * ((float)local_140._0_4_ + 0.0);
            local_1a0[1] = fVar129 * ((float)local_140._4_4_ + 1.0);
            local_1a0[2] = fVar129 * (fStack_138 + 2.0);
            local_1a0[3] = fVar129 * (fStack_134 + 3.0);
            fStack_190 = fVar129 * (fStack_130 + 4.0);
            fStack_18c = fVar129 * (fStack_12c + 5.0);
            fStack_188 = fVar129 * (fStack_128 + 6.0);
            fStack_184 = fStack_124 + 7.0;
            local_360._0_8_ = auVar151._0_8_;
            local_360._8_8_ = auVar151._8_8_;
            local_180 = local_360._0_8_;
            uStack_178 = local_360._8_8_;
            uStack_170 = 0;
            uStack_168 = 0;
            local_160 = local_520;
            auVar123._8_4_ = 0x7f800000;
            auVar123._0_8_ = 0x7f8000007f800000;
            auVar123._12_4_ = 0x7f800000;
            auVar123._16_4_ = 0x7f800000;
            auVar123._20_4_ = 0x7f800000;
            auVar123._24_4_ = 0x7f800000;
            auVar123._28_4_ = 0x7f800000;
            auVar98 = vblendvps_avx(auVar123,local_520,local_5a0[0]);
            auVar142 = vshufps_avx(auVar98,auVar98,0xb1);
            auVar142 = vminps_avx(auVar98,auVar142);
            auVar152 = vshufpd_avx(auVar142,auVar142,5);
            auVar142 = vminps_avx(auVar142,auVar152);
            auVar152 = vpermpd_avx2(auVar142,0x4e);
            auVar142 = vminps_avx(auVar142,auVar152);
            auVar142 = vcmpps_avx(auVar98,auVar142,0);
            auVar152 = local_5a0[0] & auVar142;
            auVar98 = local_5a0[0];
            if ((((((((auVar152 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar152 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar152 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar152 >> 0x7f,0) != '\0') ||
                  (auVar152 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar152 >> 0xbf,0) != '\0') ||
                (auVar152 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar152[0x1f] < '\0') {
              auVar98 = vandps_avx(auVar142,local_5a0[0]);
            }
            uVar75 = vmovmskps_avx(auVar98);
            uVar78 = 0;
            for (; (uVar75 & 1) == 0; uVar75 = uVar75 >> 1 | 0x80000000) {
              uVar78 = uVar78 + 1;
            }
            uVar76 = (ulong)uVar78;
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              fVar129 = local_1a0[uVar76];
              uVar109 = *(undefined4 *)((long)&local_180 + uVar76 * 4);
              fVar104 = 1.0 - fVar129;
              fVar102 = fVar104 * fVar104 * -3.0;
              auVar151 = vfmadd231ss_fma(ZEXT416((uint)(fVar104 * fVar104)),
                                         ZEXT416((uint)(fVar129 * fVar104)),ZEXT416(0xc0000000));
              auVar12 = vfmsub132ss_fma(ZEXT416((uint)(fVar129 * fVar104)),
                                        ZEXT416((uint)(fVar129 * fVar129)),ZEXT416(0x40000000));
              fVar104 = auVar151._0_4_ * 3.0;
              fVar193 = auVar12._0_4_ * 3.0;
              fVar194 = fVar129 * fVar129 * 3.0;
              auVar166._0_4_ = fVar194 * (float)local_730._0_4_;
              auVar166._4_4_ = fVar194 * (float)local_730._4_4_;
              auVar166._8_4_ = fVar194 * (float)uStack_728;
              auVar166._12_4_ = fVar194 * uStack_728._4_4_;
              auVar174 = ZEXT1664(auVar166);
              auVar134._4_4_ = fVar193;
              auVar134._0_4_ = fVar193;
              auVar134._8_4_ = fVar193;
              auVar134._12_4_ = fVar193;
              auVar151 = vfmadd132ps_fma(auVar134,auVar166,auVar16);
              auVar149._4_4_ = fVar104;
              auVar149._0_4_ = fVar104;
              auVar149._8_4_ = fVar104;
              auVar149._12_4_ = fVar104;
              auVar151 = vfmadd132ps_fma(auVar149,auVar151,auVar85);
              auVar135._4_4_ = fVar102;
              auVar135._0_4_ = fVar102;
              auVar135._8_4_ = fVar102;
              auVar135._12_4_ = fVar102;
              auVar151 = vfmadd132ps_fma(auVar135,auVar151,local_720);
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_160 + uVar76 * 4);
              *(int *)(ray + k * 4 + 0xc0) = auVar151._0_4_;
              uVar179 = vextractps_avx(auVar151,1);
              *(undefined4 *)(ray + k * 4 + 0xd0) = uVar179;
              uVar179 = vextractps_avx(auVar151,2);
              *(undefined4 *)(ray + k * 4 + 0xe0) = uVar179;
              *(float *)(ray + k * 4 + 0xf0) = fVar129;
              *(undefined4 *)(ray + k * 4 + 0x100) = uVar109;
              *(uint *)(ray + k * 4 + 0x110) = uVar8;
              *(uint *)(ray + k * 4 + 0x120) = uVar7;
              *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
              *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
            }
            else {
              local_600._0_16_ = CONCAT412(uVar7,CONCAT48(uVar7,CONCAT44(uVar7,uVar7)));
              local_600 = ZEXT1632(local_600._0_16_);
              local_480._0_8_ = CONCAT44(uVar8,uVar8);
              local_480 = ZEXT1632(CONCAT412(uVar8,CONCAT48(uVar8,local_480._0_8_)));
              local_4a0 = ZEXT1632(*local_650);
              local_860._0_32_ = ZEXT432(*(uint *)(ray + k * 4 + 0x80));
              local_6c0 = auVar183;
              local_6a0 = auVar198;
              local_648 = ray;
              _local_620 = auVar206;
              while( true ) {
                auVar98 = local_860._0_32_;
                local_3e0 = local_1a0[uVar76];
                local_3d0 = *(undefined4 *)((long)&local_180 + uVar76 * 4);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_160 + uVar76 * 4);
                fVar104 = 1.0 - local_3e0;
                auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar104 * fVar104)),
                                          ZEXT416((uint)(local_3e0 * fVar104)),ZEXT416(0xc0000000));
                auVar151 = vfmsub132ss_fma(ZEXT416((uint)(local_3e0 * fVar104)),
                                           ZEXT416((uint)(local_3e0 * local_3e0)),
                                           ZEXT416(0x40000000));
                fVar129 = auVar151._0_4_ * 3.0;
                fVar102 = local_3e0 * local_3e0 * 3.0;
                auVar169._0_4_ = fVar102 * (float)local_730._0_4_;
                auVar169._4_4_ = fVar102 * (float)local_730._4_4_;
                auVar169._8_4_ = fVar102 * (float)uStack_728;
                auVar169._12_4_ = fVar102 * uStack_728._4_4_;
                auVar174 = ZEXT1664(auVar169);
                auVar140._4_4_ = fVar129;
                auVar140._0_4_ = fVar129;
                auVar140._8_4_ = fVar129;
                auVar140._12_4_ = fVar129;
                auVar151 = vfmadd132ps_fma(auVar140,auVar169,auVar16);
                fVar129 = auVar12._0_4_ * 3.0;
                auVar160._4_4_ = fVar129;
                auVar160._0_4_ = fVar129;
                auVar160._8_4_ = fVar129;
                auVar160._12_4_ = fVar129;
                auVar151 = vfmadd132ps_fma(auVar160,auVar151,auVar85);
                fVar129 = fVar104 * fVar104 * -3.0;
                local_710.context = context->user;
                auVar141._4_4_ = fVar129;
                auVar141._0_4_ = fVar129;
                auVar141._8_4_ = fVar129;
                auVar141._12_4_ = fVar129;
                auVar12 = vfmadd132ps_fma(auVar141,auVar151,local_720);
                local_410 = auVar12._0_4_;
                uStack_40c = local_410;
                uStack_408 = local_410;
                uStack_404 = local_410;
                auVar151 = vshufps_avx(auVar12,auVar12,0x55);
                local_400 = auVar151;
                local_3f0 = vshufps_avx(auVar12,auVar12,0xaa);
                fStack_3dc = local_3e0;
                fStack_3d8 = local_3e0;
                fStack_3d4 = local_3e0;
                uStack_3cc = local_3d0;
                uStack_3c8 = local_3d0;
                uStack_3c4 = local_3d0;
                local_3c0 = local_480._0_8_;
                uStack_3b8 = local_480._8_8_;
                local_3b0 = local_600._0_16_;
                vpcmpeqd_avx2(ZEXT1632(local_600._0_16_),ZEXT1632(local_600._0_16_));
                uStack_39c = (local_710.context)->instID[0];
                local_3a0 = uStack_39c;
                uStack_398 = uStack_39c;
                uStack_394 = uStack_39c;
                uStack_390 = (local_710.context)->instPrimID[0];
                uStack_38c = uStack_390;
                uStack_388 = uStack_390;
                uStack_384 = uStack_390;
                local_7b0 = local_4a0._0_16_;
                local_710.valid = (int *)local_7b0;
                local_710.geometryUserPtr = pGVar10->userPtr;
                local_710.hit = (RTCHitN *)&local_410;
                local_710.N = 4;
                local_710.ray = (RTCRayN *)ray;
                if (pGVar10->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                  auVar174 = ZEXT1664(auVar169);
                  (*pGVar10->intersectionFilterN)(&local_710);
                  auVar209 = ZEXT3264(_local_620);
                  auVar128 = ZEXT3264(local_6a0);
                  auVar185 = ZEXT3264(local_6c0);
                  auVar215 = ZEXT3264(local_780);
                  auVar203 = ZEXT3264(local_760);
                  auVar192 = ZEXT3264(local_680);
                  ray = local_648;
                  pre = local_790;
                  prim = local_788;
                  pLVar81 = local_798;
                }
                if (local_7b0 == (undefined1  [16])0x0) {
                  auVar151 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                  auVar151 = auVar151 ^ _DAT_01f7ae20;
                }
                else {
                  p_Var11 = context->args->filter;
                  if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar10->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    auVar174 = ZEXT1664(auVar174._0_16_);
                    (*p_Var11)(&local_710);
                    auVar209 = ZEXT3264(_local_620);
                    auVar128 = ZEXT3264(local_6a0);
                    auVar185 = ZEXT3264(local_6c0);
                    auVar215 = ZEXT3264(local_780);
                    auVar203 = ZEXT3264(local_760);
                    auVar192 = ZEXT3264(local_680);
                    ray = local_648;
                    pre = local_790;
                    prim = local_788;
                    pLVar81 = local_798;
                  }
                  auVar12 = vpcmpeqd_avx(local_7b0,_DAT_01f7aa10);
                  auVar13 = vpcmpeqd_avx(auVar151,auVar151);
                  auVar151 = auVar12 ^ auVar13;
                  if (local_7b0 != (undefined1  [16])0x0) {
                    auVar12 = auVar12 ^ auVar13;
                    auVar13 = vmaskmovps_avx(auVar12,*(undefined1 (*) [16])local_710.hit);
                    *(undefined1 (*) [16])(local_710.ray + 0xc0) = auVar13;
                    auVar13 = vmaskmovps_avx(auVar12,*(undefined1 (*) [16])(local_710.hit + 0x10));
                    *(undefined1 (*) [16])(local_710.ray + 0xd0) = auVar13;
                    auVar13 = vmaskmovps_avx(auVar12,*(undefined1 (*) [16])(local_710.hit + 0x20));
                    *(undefined1 (*) [16])(local_710.ray + 0xe0) = auVar13;
                    auVar13 = vmaskmovps_avx(auVar12,*(undefined1 (*) [16])(local_710.hit + 0x30));
                    *(undefined1 (*) [16])(local_710.ray + 0xf0) = auVar13;
                    auVar13 = vmaskmovps_avx(auVar12,*(undefined1 (*) [16])(local_710.hit + 0x40));
                    *(undefined1 (*) [16])(local_710.ray + 0x100) = auVar13;
                    auVar13 = vmaskmovps_avx(auVar12,*(undefined1 (*) [16])(local_710.hit + 0x50));
                    *(undefined1 (*) [16])(local_710.ray + 0x110) = auVar13;
                    auVar13 = vmaskmovps_avx(auVar12,*(undefined1 (*) [16])(local_710.hit + 0x60));
                    *(undefined1 (*) [16])(local_710.ray + 0x120) = auVar13;
                    auVar13 = vmaskmovps_avx(auVar12,*(undefined1 (*) [16])(local_710.hit + 0x70));
                    *(undefined1 (*) [16])(local_710.ray + 0x130) = auVar13;
                    auVar12 = vmaskmovps_avx(auVar12,*(undefined1 (*) [16])(local_710.hit + 0x80));
                    *(undefined1 (*) [16])(local_710.ray + 0x140) = auVar12;
                  }
                }
                auVar142 = local_520;
                auVar183 = auVar185._0_32_;
                auVar198 = auVar128._0_32_;
                auVar115._8_8_ = 0x100000001;
                auVar115._0_8_ = 0x100000001;
                if ((auVar115 & auVar151) == (undefined1  [16])0x0) {
                  *(undefined4 *)(ray + k * 4 + 0x80) = local_860._0_4_;
                }
                else {
                  local_860._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                  local_860._4_4_ = 0;
                  local_860._8_4_ = 0;
                  local_860._12_4_ = 0;
                }
                *(undefined4 *)(local_5a0[0] + uVar76 * 4) = 0;
                local_860._16_16_ = auVar98._16_16_;
                auVar100._4_4_ = local_860._0_4_;
                auVar100._0_4_ = local_860._0_4_;
                auVar100._8_4_ = local_860._0_4_;
                auVar100._12_4_ = local_860._0_4_;
                auVar100._16_4_ = local_860._0_4_;
                auVar100._20_4_ = local_860._0_4_;
                auVar100._24_4_ = local_860._0_4_;
                auVar100._28_4_ = local_860._0_4_;
                auVar152 = vcmpps_avx(auVar142,auVar100,2);
                auVar98 = vandps_avx(auVar152,local_5a0[0]);
                local_5a0[0] = local_5a0[0] & auVar152;
                if ((((((((local_5a0[0] >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (local_5a0[0] >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (local_5a0[0] >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(local_5a0[0] >> 0x7f,0) == '\0') &&
                      (local_5a0[0] & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(local_5a0[0] >> 0xbf,0) == '\0') &&
                    (local_5a0[0] & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < local_5a0[0][0x1f]) break;
                auVar127._8_4_ = 0x7f800000;
                auVar127._0_8_ = 0x7f8000007f800000;
                auVar127._12_4_ = 0x7f800000;
                auVar127._16_4_ = 0x7f800000;
                auVar127._20_4_ = 0x7f800000;
                auVar127._24_4_ = 0x7f800000;
                auVar127._28_4_ = 0x7f800000;
                auVar142 = vblendvps_avx(auVar127,auVar142,auVar98);
                auVar152 = vshufps_avx(auVar142,auVar142,0xb1);
                auVar152 = vminps_avx(auVar142,auVar152);
                auVar97 = vshufpd_avx(auVar152,auVar152,5);
                auVar152 = vminps_avx(auVar152,auVar97);
                auVar97 = vpermpd_avx2(auVar152,0x4e);
                auVar152 = vminps_avx(auVar152,auVar97);
                auVar152 = vcmpps_avx(auVar142,auVar152,0);
                auVar97 = auVar98 & auVar152;
                auVar142 = auVar98;
                if ((((((((auVar97 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar97 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar97 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar97 >> 0x7f,0) != '\0') ||
                      (auVar97 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar97 >> 0xbf,0) != '\0') ||
                    (auVar97 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar97[0x1f] < '\0') {
                  auVar142 = vandps_avx(auVar152,auVar98);
                }
                uVar75 = vmovmskps_avx(auVar142);
                uVar78 = 0;
                for (; (uVar75 & 1) == 0; uVar75 = uVar75 >> 1 | 0x80000000) {
                  uVar78 = uVar78 + 1;
                }
                uVar76 = (ulong)uVar78;
                local_5a0[0] = auVar98;
              }
            }
          }
          fVar129 = (float)local_5c0;
          fVar102 = local_5c0._4_4_;
          fVar104 = (float)uStack_5b8;
          fVar193 = uStack_5b8._4_4_;
          fVar194 = (float)uStack_5b0;
          fVar195 = uStack_5b0._4_4_;
          fVar156 = (float)uStack_5a8;
        }
        auVar128 = ZEXT3264(local_640);
      }
LAB_015edf67:
      if (8 < iVar9) {
        _local_620 = auVar209._0_32_;
        local_4e0._4_4_ = iVar9;
        local_4e0._0_4_ = iVar9;
        local_4e0._8_4_ = iVar9;
        local_4e0._12_4_ = iVar9;
        local_4e0._16_4_ = iVar9;
        local_4e0._20_4_ = iVar9;
        local_4e0._24_4_ = iVar9;
        local_4e0._28_4_ = iVar9;
        local_320._4_4_ = fVar130;
        local_320._0_4_ = fVar130;
        fStack_318 = fVar130;
        fStack_314 = fVar130;
        fStack_310 = fVar130;
        fStack_30c = fVar130;
        fStack_308 = fVar130;
        fStack_304 = fVar130;
        local_340._4_4_ = local_6e0._0_4_;
        local_340._0_4_ = local_6e0._0_4_;
        local_340._8_4_ = local_6e0._0_4_;
        local_340._12_4_ = local_6e0._0_4_;
        local_340._16_4_ = local_6e0._0_4_;
        local_340._20_4_ = local_6e0._0_4_;
        local_340._24_4_ = local_6e0._0_4_;
        local_340._28_4_ = local_6e0._0_4_;
        local_e0 = 1.0 / (float)local_5d0._0_4_;
        fStack_dc = local_e0;
        fStack_d8 = local_e0;
        fStack_d4 = local_e0;
        fStack_d0 = local_e0;
        fStack_cc = local_e0;
        fStack_c8 = local_e0;
        fStack_c4 = local_e0;
        local_5d0._4_4_ = uVar7;
        local_5d0._0_4_ = uVar7;
        uStack_5c8 = uVar7;
        uStack_5c4 = uVar7;
        local_2b0 = uVar8;
        uStack_2ac = uVar8;
        uStack_2a8 = uVar8;
        uStack_2a4 = uVar8;
        lVar77 = 8;
        local_6c0 = auVar183;
        local_6a0 = auVar198;
        do {
          auVar98 = *(undefined1 (*) [32])(bezier_basis0 + lVar77 * 4 + lVar21);
          auVar142 = *(undefined1 (*) [32])(lVar21 + 0x21aa768 + lVar77 * 4);
          local_6e0 = *(undefined1 (*) [32])(lVar21 + 0x21aabec + lVar77 * 4);
          pauVar1 = (undefined1 (*) [28])(lVar21 + 0x21ab070 + lVar77 * 4);
          fVar82 = *(float *)*pauVar1;
          fVar101 = *(float *)(*pauVar1 + 4);
          fVar103 = *(float *)(*pauVar1 + 8);
          fVar105 = *(float *)(*pauVar1 + 0xc);
          fVar106 = *(float *)(*pauVar1 + 0x10);
          fVar107 = *(float *)(*pauVar1 + 0x14);
          fVar108 = *(float *)(*pauVar1 + 0x18);
          auVar73 = *pauVar1;
          auVar185._0_4_ = local_440 * fVar82;
          auVar185._4_4_ = fStack_43c * fVar101;
          auVar185._8_4_ = fStack_438 * fVar103;
          auVar185._12_4_ = fStack_434 * fVar105;
          auVar185._16_4_ = fStack_430 * fVar106;
          auVar185._20_4_ = fStack_42c * fVar107;
          auVar185._28_36_ = auVar209._28_36_;
          auVar185._24_4_ = fStack_428 * fVar108;
          auVar209._0_4_ = fVar129 * fVar82;
          auVar209._4_4_ = fVar102 * fVar101;
          auVar209._8_4_ = fVar104 * fVar103;
          auVar209._12_4_ = fVar193 * fVar105;
          auVar209._16_4_ = fVar194 * fVar106;
          auVar209._20_4_ = fVar195 * fVar107;
          auVar209._28_36_ = auVar174._28_36_;
          auVar209._24_4_ = fVar156 * fVar108;
          auVar151 = vfmadd231ps_fma(auVar185._0_32_,local_6e0,auVar192._0_32_);
          auVar91 = auVar128._0_32_;
          auVar12 = vfmadd231ps_fma(auVar209._0_32_,local_6e0,auVar91);
          auVar151 = vfmadd231ps_fma(ZEXT1632(auVar151),auVar142,auVar203._0_32_);
          auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar142,local_460);
          auVar151 = vfmadd231ps_fma(ZEXT1632(auVar151),auVar98,auVar215._0_32_);
          auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar98,local_560);
          auVar152 = *(undefined1 (*) [32])(bezier_basis1 + lVar77 * 4 + lVar21);
          auVar97 = *(undefined1 (*) [32])(lVar21 + 0x21acb88 + lVar77 * 4);
          auVar121 = *(undefined1 (*) [32])(lVar21 + 0x21ad00c + lVar77 * 4);
          pfVar2 = (float *)(lVar21 + 0x21ad490 + lVar77 * 4);
          fVar71 = *pfVar2;
          fVar72 = pfVar2[1];
          fVar204 = pfVar2[2];
          fVar210 = pfVar2[3];
          fVar216 = pfVar2[4];
          fVar217 = pfVar2[5];
          fVar218 = pfVar2[6];
          auVar174._0_4_ = fVar71 * local_440;
          auVar174._4_4_ = fVar72 * fStack_43c;
          auVar174._8_4_ = fVar204 * fStack_438;
          auVar174._12_4_ = fVar210 * fStack_434;
          auVar174._16_4_ = fVar216 * fStack_430;
          auVar174._20_4_ = fVar217 * fStack_42c;
          auVar174._28_36_ = auVar203._28_36_;
          auVar174._24_4_ = fVar218 * fStack_428;
          auVar40._4_4_ = fVar72 * fVar102;
          auVar40._0_4_ = fVar71 * fVar129;
          auVar40._8_4_ = fVar204 * fVar104;
          auVar40._12_4_ = fVar210 * fVar193;
          auVar40._16_4_ = fVar216 * fVar194;
          auVar40._20_4_ = fVar217 * fVar195;
          auVar40._24_4_ = fVar218 * fVar156;
          auVar40._28_4_ = fStack_424;
          auVar13 = vfmadd231ps_fma(auVar174._0_32_,auVar121,auVar192._0_32_);
          auVar14 = vfmadd231ps_fma(auVar40,auVar121,auVar91);
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar97,auVar203._0_32_);
          auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar97,local_460);
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar152,auVar215._0_32_);
          auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar152,local_560);
          local_480 = ZEXT1632(auVar13);
          local_300 = ZEXT1632(auVar151);
          auVar187 = vsubps_avx(local_480,local_300);
          local_600 = ZEXT1632(auVar14);
          local_4a0 = ZEXT1632(auVar12);
          auVar191 = vsubps_avx(local_600,local_4a0);
          auVar70._4_4_ = auVar187._4_4_ * auVar12._4_4_;
          auVar70._0_4_ = auVar187._0_4_ * auVar12._0_4_;
          auVar70._8_4_ = auVar187._8_4_ * auVar12._8_4_;
          auVar70._12_4_ = auVar187._12_4_ * auVar12._12_4_;
          auVar70._16_4_ = auVar187._16_4_ * 0.0;
          auVar70._20_4_ = auVar187._20_4_ * 0.0;
          auVar70._24_4_ = auVar187._24_4_ * 0.0;
          auVar70._28_4_ = local_460._28_4_;
          auVar174 = ZEXT3264(auVar91);
          fVar130 = auVar191._0_4_;
          auVar192._0_4_ = auVar151._0_4_ * fVar130;
          fVar129 = auVar191._4_4_;
          auVar192._4_4_ = auVar151._4_4_ * fVar129;
          fVar102 = auVar191._8_4_;
          auVar192._8_4_ = auVar151._8_4_ * fVar102;
          fVar104 = auVar191._12_4_;
          auVar192._12_4_ = auVar151._12_4_ * fVar104;
          fVar193 = auVar191._16_4_;
          auVar192._16_4_ = fVar193 * 0.0;
          fVar194 = auVar191._20_4_;
          auVar192._20_4_ = fVar194 * 0.0;
          fVar195 = auVar191._24_4_;
          auVar192._28_36_ = auVar128._28_36_;
          auVar192._24_4_ = fVar195 * 0.0;
          auVar209 = ZEXT3264(local_6e0);
          auVar17 = vsubps_avx(auVar70,auVar192._0_32_);
          auVar41._4_4_ = (float)local_120._4_4_ * fVar101;
          auVar41._0_4_ = (float)local_120._0_4_ * fVar82;
          auVar41._8_4_ = fStack_118 * fVar103;
          auVar41._12_4_ = fStack_114 * fVar105;
          auVar41._16_4_ = fStack_110 * fVar106;
          auVar41._20_4_ = fStack_10c * fVar107;
          auVar41._24_4_ = fStack_108 * fVar108;
          auVar41._28_4_ = local_460._28_4_;
          auVar151 = vfmadd231ps_fma(auVar41,local_6e0,local_a0);
          auVar151 = vfmadd231ps_fma(ZEXT1632(auVar151),local_80,auVar142);
          auVar151 = vfmadd231ps_fma(ZEXT1632(auVar151),local_100,auVar98);
          auVar42._4_4_ = fVar72 * (float)local_120._4_4_;
          auVar42._0_4_ = fVar71 * (float)local_120._0_4_;
          auVar42._8_4_ = fVar204 * fStack_118;
          auVar42._12_4_ = fVar210 * fStack_114;
          auVar42._16_4_ = fVar216 * fStack_110;
          auVar42._20_4_ = fVar217 * fStack_10c;
          auVar42._24_4_ = fVar218 * fStack_108;
          auVar42._28_4_ = uStack_104;
          auVar12 = vfmadd231ps_fma(auVar42,auVar121,local_a0);
          auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar97,local_80);
          auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar152,local_100);
          auVar43._4_4_ = fVar129 * fVar129;
          auVar43._0_4_ = fVar130 * fVar130;
          auVar43._8_4_ = fVar102 * fVar102;
          auVar43._12_4_ = fVar104 * fVar104;
          auVar43._16_4_ = fVar193 * fVar193;
          auVar43._20_4_ = fVar194 * fVar194;
          auVar43._24_4_ = fVar195 * fVar195;
          auVar43._28_4_ = local_100._28_4_;
          auVar13 = vfmadd231ps_fma(auVar43,auVar187,auVar187);
          auVar5 = vmaxps_avx(ZEXT1632(auVar151),ZEXT1632(auVar12));
          auVar188._0_4_ = auVar5._0_4_ * auVar5._0_4_ * auVar13._0_4_;
          auVar188._4_4_ = auVar5._4_4_ * auVar5._4_4_ * auVar13._4_4_;
          auVar188._8_4_ = auVar5._8_4_ * auVar5._8_4_ * auVar13._8_4_;
          auVar188._12_4_ = auVar5._12_4_ * auVar5._12_4_ * auVar13._12_4_;
          auVar188._16_4_ = auVar5._16_4_ * auVar5._16_4_ * 0.0;
          auVar188._20_4_ = auVar5._20_4_ * auVar5._20_4_ * 0.0;
          auVar188._24_4_ = auVar5._24_4_ * auVar5._24_4_ * 0.0;
          auVar188._28_4_ = 0;
          auVar44._4_4_ = auVar17._4_4_ * auVar17._4_4_;
          auVar44._0_4_ = auVar17._0_4_ * auVar17._0_4_;
          auVar44._8_4_ = auVar17._8_4_ * auVar17._8_4_;
          auVar44._12_4_ = auVar17._12_4_ * auVar17._12_4_;
          auVar44._16_4_ = auVar17._16_4_ * auVar17._16_4_;
          auVar44._20_4_ = auVar17._20_4_ * auVar17._20_4_;
          auVar44._24_4_ = auVar17._24_4_ * auVar17._24_4_;
          auVar44._28_4_ = auVar17._28_4_;
          auVar5 = vcmpps_avx(auVar44,auVar188,2);
          local_220 = (int)lVar77;
          auVar189._4_4_ = local_220;
          auVar189._0_4_ = local_220;
          auVar189._8_4_ = local_220;
          auVar189._12_4_ = local_220;
          auVar189._16_4_ = local_220;
          auVar189._20_4_ = local_220;
          auVar189._24_4_ = local_220;
          auVar189._28_4_ = local_220;
          auVar17 = vpor_avx2(auVar189,_DAT_01fe9900);
          auVar145 = vpcmpgtd_avx2(local_4e0,auVar17);
          auVar17 = auVar145 & auVar5;
          if ((((((((auVar17 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar17 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar17 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar17 >> 0x7f,0) == '\0') &&
                (auVar17 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar17 >> 0xbf,0) == '\0') &&
              (auVar17 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar17[0x1f]) {
            auVar192 = ZEXT3264(local_680);
            auVar203 = ZEXT3264(local_760);
            auVar215 = ZEXT3264(local_780);
          }
          else {
            local_500 = vandps_avx(auVar145,auVar5);
            auVar45._4_4_ = fVar72 * (float)local_620._4_4_;
            auVar45._0_4_ = fVar71 * (float)local_620._0_4_;
            auVar45._8_4_ = fVar204 * fStack_618;
            auVar45._12_4_ = fVar210 * fStack_614;
            auVar45._16_4_ = fVar216 * fStack_610;
            auVar45._20_4_ = fVar217 * fStack_60c;
            auVar45._24_4_ = fVar218 * fStack_608;
            auVar45._28_4_ = auVar5._28_4_;
            auVar13 = vfmadd213ps_fma(auVar121,local_2e0,auVar45);
            auVar13 = vfmadd213ps_fma(auVar97,local_6a0,ZEXT1632(auVar13));
            auVar13 = vfmadd132ps_fma(auVar152,ZEXT1632(auVar13),local_6c0);
            local_4c0._0_4_ = auVar73._0_4_;
            local_4c0._4_4_ = auVar73._4_4_;
            fStack_4b8 = auVar73._8_4_;
            fStack_4b4 = auVar73._12_4_;
            fStack_4b0 = auVar73._16_4_;
            fStack_4ac = auVar73._20_4_;
            fStack_4a8 = auVar73._24_4_;
            auVar153._0_4_ = (float)local_620._0_4_ * (float)local_4c0._0_4_;
            auVar153._4_4_ = (float)local_620._4_4_ * (float)local_4c0._4_4_;
            auVar153._8_4_ = fStack_618 * fStack_4b8;
            auVar153._12_4_ = fStack_614 * fStack_4b4;
            auVar153._16_4_ = fStack_610 * fStack_4b0;
            auVar153._20_4_ = fStack_60c * fStack_4ac;
            auVar153._24_4_ = fStack_608 * fStack_4a8;
            auVar153._28_4_ = 0;
            auVar14 = vfmadd213ps_fma(local_6e0,local_2e0,auVar153);
            auVar14 = vfmadd213ps_fma(auVar142,local_6a0,ZEXT1632(auVar14));
            auVar142 = *(undefined1 (*) [32])(lVar21 + 0x21ab4f4 + lVar77 * 4);
            auVar152 = *(undefined1 (*) [32])(lVar21 + 0x21ab978 + lVar77 * 4);
            auVar97 = *(undefined1 (*) [32])(lVar21 + 0x21abdfc + lVar77 * 4);
            pfVar2 = (float *)(lVar21 + 0x21ac280 + lVar77 * 4);
            fVar130 = *pfVar2;
            fVar129 = pfVar2[1];
            fVar102 = pfVar2[2];
            fVar104 = pfVar2[3];
            fVar193 = pfVar2[4];
            fVar194 = pfVar2[5];
            fVar195 = pfVar2[6];
            auVar46._4_4_ = fStack_43c * fVar129;
            auVar46._0_4_ = local_440 * fVar130;
            auVar46._8_4_ = fStack_438 * fVar102;
            auVar46._12_4_ = fStack_434 * fVar104;
            auVar46._16_4_ = fStack_430 * fVar193;
            auVar46._20_4_ = fStack_42c * fVar194;
            auVar46._24_4_ = fStack_428 * fVar195;
            auVar46._28_4_ = auVar187._28_4_;
            auVar207._0_4_ = (float)local_5c0 * fVar130;
            auVar207._4_4_ = local_5c0._4_4_ * fVar129;
            auVar207._8_4_ = (float)uStack_5b8 * fVar102;
            auVar207._12_4_ = uStack_5b8._4_4_ * fVar104;
            auVar207._16_4_ = (float)uStack_5b0 * fVar193;
            auVar207._20_4_ = uStack_5b0._4_4_ * fVar194;
            auVar207._24_4_ = (float)uStack_5a8 * fVar195;
            auVar207._28_4_ = 0;
            auVar47._4_4_ = fVar129 * (float)local_620._4_4_;
            auVar47._0_4_ = fVar130 * (float)local_620._0_4_;
            auVar47._8_4_ = fVar102 * fStack_618;
            auVar47._12_4_ = fVar104 * fStack_614;
            auVar47._16_4_ = fVar193 * fStack_610;
            auVar47._20_4_ = fVar194 * fStack_60c;
            auVar47._24_4_ = fVar195 * fStack_608;
            auVar47._28_4_ = pfVar2[7];
            auVar15 = vfmadd231ps_fma(auVar46,auVar97,local_680);
            auVar87 = vfmadd231ps_fma(auVar207,auVar97,auVar91);
            auVar86 = vfmadd231ps_fma(auVar47,local_2e0,auVar97);
            auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar152,local_760);
            auVar87 = vfmadd231ps_fma(ZEXT1632(auVar87),auVar152,local_460);
            auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),local_6a0,auVar152);
            auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar142,local_780);
            auVar87 = vfmadd231ps_fma(ZEXT1632(auVar87),auVar142,local_560);
            auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar142,local_6c0);
            pfVar2 = (float *)(lVar21 + 0x21ae6a0 + lVar77 * 4);
            fVar130 = *pfVar2;
            fVar129 = pfVar2[1];
            fVar102 = pfVar2[2];
            fVar104 = pfVar2[3];
            fVar193 = pfVar2[4];
            fVar194 = pfVar2[5];
            fVar195 = pfVar2[6];
            auVar48._4_4_ = fStack_43c * fVar129;
            auVar48._0_4_ = local_440 * fVar130;
            auVar48._8_4_ = fStack_438 * fVar102;
            auVar48._12_4_ = fStack_434 * fVar104;
            auVar48._16_4_ = fStack_430 * fVar193;
            auVar48._20_4_ = fStack_42c * fVar194;
            auVar48._24_4_ = fStack_428 * fVar195;
            auVar48._28_4_ = fStack_424;
            auVar49._4_4_ = local_5c0._4_4_ * fVar129;
            auVar49._0_4_ = (float)local_5c0 * fVar130;
            auVar49._8_4_ = (float)uStack_5b8 * fVar102;
            auVar49._12_4_ = uStack_5b8._4_4_ * fVar104;
            auVar49._16_4_ = (float)uStack_5b0 * fVar193;
            auVar49._20_4_ = uStack_5b0._4_4_ * fVar194;
            auVar49._24_4_ = (float)uStack_5a8 * fVar195;
            auVar49._28_4_ = uStack_5a8._4_4_;
            auVar50._4_4_ = (float)local_620._4_4_ * fVar129;
            auVar50._0_4_ = (float)local_620._0_4_ * fVar130;
            auVar50._8_4_ = fStack_618 * fVar102;
            auVar50._12_4_ = fStack_614 * fVar104;
            auVar50._16_4_ = fStack_610 * fVar193;
            auVar50._20_4_ = fStack_60c * fVar194;
            auVar50._24_4_ = fStack_608 * fVar195;
            auVar50._28_4_ = pfVar2[7];
            auVar142 = *(undefined1 (*) [32])(lVar21 + 0x21ae21c + lVar77 * 4);
            auVar131 = vfmadd231ps_fma(auVar48,auVar142,local_680);
            auVar111 = vfmadd231ps_fma(auVar49,auVar142,local_640);
            auVar112 = vfmadd231ps_fma(auVar50,local_2e0,auVar142);
            auVar142 = *(undefined1 (*) [32])(lVar21 + 0x21add98 + lVar77 * 4);
            auVar131 = vfmadd231ps_fma(ZEXT1632(auVar131),auVar142,local_760);
            auVar111 = vfmadd231ps_fma(ZEXT1632(auVar111),auVar142,local_460);
            auVar112 = vfmadd231ps_fma(ZEXT1632(auVar112),auVar142,local_6a0);
            auVar142 = *(undefined1 (*) [32])(lVar21 + 0x21ad914 + lVar77 * 4);
            auVar131 = vfmadd231ps_fma(ZEXT1632(auVar131),auVar142,local_780);
            auVar111 = vfmadd231ps_fma(ZEXT1632(auVar111),auVar142,local_560);
            auVar112 = vfmadd231ps_fma(ZEXT1632(auVar112),local_6c0,auVar142);
            auVar190._8_4_ = 0x7fffffff;
            auVar190._0_8_ = 0x7fffffff7fffffff;
            auVar190._12_4_ = 0x7fffffff;
            auVar190._16_4_ = 0x7fffffff;
            auVar190._20_4_ = 0x7fffffff;
            auVar190._24_4_ = 0x7fffffff;
            auVar190._28_4_ = 0x7fffffff;
            auVar142 = vandps_avx(ZEXT1632(auVar15),auVar190);
            auVar152 = vandps_avx(ZEXT1632(auVar87),auVar190);
            auVar152 = vmaxps_avx(auVar142,auVar152);
            auVar142 = vandps_avx(ZEXT1632(auVar86),auVar190);
            auVar142 = vmaxps_avx(auVar152,auVar142);
            auVar142 = vcmpps_avx(auVar142,_local_320,1);
            auVar97 = vblendvps_avx(ZEXT1632(auVar15),auVar187,auVar142);
            auVar121 = vblendvps_avx(ZEXT1632(auVar87),auVar191,auVar142);
            auVar142 = vandps_avx(ZEXT1632(auVar131),auVar190);
            auVar152 = vandps_avx(ZEXT1632(auVar111),auVar190);
            auVar152 = vmaxps_avx(auVar142,auVar152);
            auVar142 = vandps_avx(auVar190,ZEXT1632(auVar112));
            auVar142 = vmaxps_avx(auVar152,auVar142);
            auVar152 = vcmpps_avx(auVar142,_local_320,1);
            auVar142 = vblendvps_avx(ZEXT1632(auVar131),auVar187,auVar152);
            auVar152 = vblendvps_avx(ZEXT1632(auVar111),auVar191,auVar152);
            auVar14 = vfmadd213ps_fma(auVar98,local_6c0,ZEXT1632(auVar14));
            auVar15 = vfmadd213ps_fma(auVar97,auVar97,ZEXT832(0) << 0x20);
            auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar121,auVar121);
            auVar98 = vrsqrtps_avx(ZEXT1632(auVar15));
            fVar130 = auVar98._0_4_;
            fVar129 = auVar98._4_4_;
            fVar102 = auVar98._8_4_;
            fVar104 = auVar98._12_4_;
            fVar193 = auVar98._16_4_;
            fVar194 = auVar98._20_4_;
            fVar195 = auVar98._24_4_;
            auVar51._4_4_ = fVar129 * fVar129 * fVar129 * auVar15._4_4_ * -0.5;
            auVar51._0_4_ = fVar130 * fVar130 * fVar130 * auVar15._0_4_ * -0.5;
            auVar51._8_4_ = fVar102 * fVar102 * fVar102 * auVar15._8_4_ * -0.5;
            auVar51._12_4_ = fVar104 * fVar104 * fVar104 * auVar15._12_4_ * -0.5;
            auVar51._16_4_ = fVar193 * fVar193 * fVar193 * -0.0;
            auVar51._20_4_ = fVar194 * fVar194 * fVar194 * -0.0;
            auVar51._24_4_ = fVar195 * fVar195 * fVar195 * -0.0;
            auVar51._28_4_ = 0;
            auVar214._8_4_ = 0x3fc00000;
            auVar214._0_8_ = 0x3fc000003fc00000;
            auVar214._12_4_ = 0x3fc00000;
            auVar214._16_4_ = 0x3fc00000;
            auVar214._20_4_ = 0x3fc00000;
            auVar214._24_4_ = 0x3fc00000;
            auVar214._28_4_ = 0x3fc00000;
            auVar15 = vfmadd231ps_fma(auVar51,auVar214,auVar98);
            fVar130 = auVar15._0_4_;
            fVar129 = auVar15._4_4_;
            auVar52._4_4_ = auVar121._4_4_ * fVar129;
            auVar52._0_4_ = auVar121._0_4_ * fVar130;
            fVar102 = auVar15._8_4_;
            auVar52._8_4_ = auVar121._8_4_ * fVar102;
            fVar104 = auVar15._12_4_;
            auVar52._12_4_ = auVar121._12_4_ * fVar104;
            auVar52._16_4_ = auVar121._16_4_ * 0.0;
            auVar52._20_4_ = auVar121._20_4_ * 0.0;
            auVar52._24_4_ = auVar121._24_4_ * 0.0;
            auVar52._28_4_ = auVar98._28_4_;
            auVar53._4_4_ = fVar129 * -auVar97._4_4_;
            auVar53._0_4_ = fVar130 * -auVar97._0_4_;
            auVar53._8_4_ = fVar102 * -auVar97._8_4_;
            auVar53._12_4_ = fVar104 * -auVar97._12_4_;
            auVar53._16_4_ = -auVar97._16_4_ * 0.0;
            auVar53._20_4_ = -auVar97._20_4_ * 0.0;
            auVar53._24_4_ = -auVar97._24_4_ * 0.0;
            auVar53._28_4_ = auVar121._28_4_;
            auVar15 = vfmadd213ps_fma(auVar142,auVar142,ZEXT832(0) << 0x20);
            auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar152,auVar152);
            auVar98 = vrsqrtps_avx(ZEXT1632(auVar15));
            auVar54._28_4_ = local_680._28_4_;
            auVar54._0_28_ =
                 ZEXT1628(CONCAT412(fVar104 * 0.0,
                                    CONCAT48(fVar102 * 0.0,CONCAT44(fVar129 * 0.0,fVar130 * 0.0))));
            fVar130 = auVar98._0_4_;
            fVar129 = auVar98._4_4_;
            fVar102 = auVar98._8_4_;
            fVar104 = auVar98._12_4_;
            fVar193 = auVar98._16_4_;
            fVar194 = auVar98._20_4_;
            fVar195 = auVar98._24_4_;
            auVar55._4_4_ = fVar129 * fVar129 * fVar129 * auVar15._4_4_ * -0.5;
            auVar55._0_4_ = fVar130 * fVar130 * fVar130 * auVar15._0_4_ * -0.5;
            auVar55._8_4_ = fVar102 * fVar102 * fVar102 * auVar15._8_4_ * -0.5;
            auVar55._12_4_ = fVar104 * fVar104 * fVar104 * auVar15._12_4_ * -0.5;
            auVar55._16_4_ = fVar193 * fVar193 * fVar193 * -0.0;
            auVar55._20_4_ = fVar194 * fVar194 * fVar194 * -0.0;
            auVar55._24_4_ = fVar195 * fVar195 * fVar195 * -0.0;
            auVar55._28_4_ = 0;
            auVar15 = vfmadd231ps_fma(auVar55,auVar214,auVar98);
            fVar130 = auVar15._0_4_;
            fVar129 = auVar15._4_4_;
            auVar56._4_4_ = auVar152._4_4_ * fVar129;
            auVar56._0_4_ = auVar152._0_4_ * fVar130;
            fVar102 = auVar15._8_4_;
            auVar56._8_4_ = auVar152._8_4_ * fVar102;
            fVar104 = auVar15._12_4_;
            auVar56._12_4_ = auVar152._12_4_ * fVar104;
            auVar56._16_4_ = auVar152._16_4_ * 0.0;
            auVar56._20_4_ = auVar152._20_4_ * 0.0;
            auVar56._24_4_ = auVar152._24_4_ * 0.0;
            auVar56._28_4_ = 0;
            auVar57._4_4_ = fVar129 * -auVar142._4_4_;
            auVar57._0_4_ = fVar130 * -auVar142._0_4_;
            auVar57._8_4_ = fVar102 * -auVar142._8_4_;
            auVar57._12_4_ = fVar104 * -auVar142._12_4_;
            auVar57._16_4_ = -auVar142._16_4_ * 0.0;
            auVar57._20_4_ = -auVar142._20_4_ * 0.0;
            auVar57._24_4_ = -auVar142._24_4_ * 0.0;
            auVar57._28_4_ = auVar98._28_4_;
            auVar58._28_4_ = 0xbf000000;
            auVar58._0_28_ =
                 ZEXT1628(CONCAT412(fVar104 * 0.0,
                                    CONCAT48(fVar102 * 0.0,CONCAT44(fVar129 * 0.0,fVar130 * 0.0))));
            auVar15 = vfmadd213ps_fma(auVar52,ZEXT1632(auVar151),local_300);
            auVar98 = ZEXT1632(auVar151);
            auVar87 = vfmadd213ps_fma(auVar53,auVar98,local_4a0);
            auVar86 = vfmadd213ps_fma(auVar54,auVar98,ZEXT1632(auVar14));
            auVar112 = vfnmadd213ps_fma(auVar52,auVar98,local_300);
            auVar131 = vfmadd213ps_fma(auVar56,ZEXT1632(auVar12),local_480);
            auVar147 = vfnmadd213ps_fma(auVar53,auVar98,local_4a0);
            auVar98 = ZEXT1632(auVar12);
            auVar111 = vfmadd213ps_fma(auVar57,auVar98,local_600);
            local_6e0 = ZEXT1632(auVar151);
            auVar151 = vfnmadd231ps_fma(ZEXT1632(auVar14),local_6e0,auVar54);
            auVar14 = vfmadd213ps_fma(auVar58,auVar98,ZEXT1632(auVar13));
            auVar158 = vfnmadd213ps_fma(auVar56,auVar98,local_480);
            auVar84 = vfnmadd213ps_fma(auVar57,auVar98,local_600);
            auVar110 = vfnmadd231ps_fma(ZEXT1632(auVar13),ZEXT1632(auVar12),auVar58);
            auVar98 = vsubps_avx(ZEXT1632(auVar111),ZEXT1632(auVar147));
            auVar142 = vsubps_avx(ZEXT1632(auVar14),ZEXT1632(auVar151));
            auVar59._4_4_ = auVar98._4_4_ * auVar151._4_4_;
            auVar59._0_4_ = auVar98._0_4_ * auVar151._0_4_;
            auVar59._8_4_ = auVar98._8_4_ * auVar151._8_4_;
            auVar59._12_4_ = auVar98._12_4_ * auVar151._12_4_;
            auVar59._16_4_ = auVar98._16_4_ * 0.0;
            auVar59._20_4_ = auVar98._20_4_ * 0.0;
            auVar59._24_4_ = auVar98._24_4_ * 0.0;
            auVar59._28_4_ = 0;
            auVar13 = vfmsub231ps_fma(auVar59,ZEXT1632(auVar147),auVar142);
            auVar60._4_4_ = auVar112._4_4_ * auVar142._4_4_;
            auVar60._0_4_ = auVar112._0_4_ * auVar142._0_4_;
            auVar60._8_4_ = auVar112._8_4_ * auVar142._8_4_;
            auVar60._12_4_ = auVar112._12_4_ * auVar142._12_4_;
            auVar60._16_4_ = auVar142._16_4_ * 0.0;
            auVar60._20_4_ = auVar142._20_4_ * 0.0;
            auVar60._24_4_ = auVar142._24_4_ * 0.0;
            auVar60._28_4_ = auVar142._28_4_;
            auVar191 = ZEXT1632(auVar112);
            auVar142 = vsubps_avx(ZEXT1632(auVar131),auVar191);
            auVar145 = ZEXT1632(auVar151);
            auVar151 = vfmsub231ps_fma(auVar60,auVar145,auVar142);
            auVar61._4_4_ = auVar147._4_4_ * auVar142._4_4_;
            auVar61._0_4_ = auVar147._0_4_ * auVar142._0_4_;
            auVar61._8_4_ = auVar147._8_4_ * auVar142._8_4_;
            auVar61._12_4_ = auVar147._12_4_ * auVar142._12_4_;
            auVar61._16_4_ = auVar142._16_4_ * 0.0;
            auVar61._20_4_ = auVar142._20_4_ * 0.0;
            auVar61._24_4_ = auVar142._24_4_ * 0.0;
            auVar61._28_4_ = auVar142._28_4_;
            auVar112 = vfmsub231ps_fma(auVar61,auVar191,auVar98);
            auVar151 = vfmadd231ps_fma(ZEXT1632(auVar112),ZEXT832(0) << 0x20,ZEXT1632(auVar151));
            auVar151 = vfmadd231ps_fma(ZEXT1632(auVar151),ZEXT832(0) << 0x20,ZEXT1632(auVar13));
            auVar91 = vcmpps_avx(ZEXT1632(auVar151),ZEXT832(0) << 0x20,2);
            auVar98 = vblendvps_avx(ZEXT1632(auVar158),ZEXT1632(auVar15),auVar91);
            auVar142 = vblendvps_avx(ZEXT1632(auVar84),ZEXT1632(auVar87),auVar91);
            auVar152 = vblendvps_avx(ZEXT1632(auVar110),ZEXT1632(auVar86),auVar91);
            auVar209 = ZEXT3264(auVar152);
            auVar97 = vblendvps_avx(auVar191,ZEXT1632(auVar131),auVar91);
            auVar121 = vblendvps_avx(ZEXT1632(auVar147),ZEXT1632(auVar111),auVar91);
            auVar5 = vblendvps_avx(auVar145,ZEXT1632(auVar14),auVar91);
            auVar191 = vblendvps_avx(ZEXT1632(auVar131),auVar191,auVar91);
            auVar17 = vblendvps_avx(ZEXT1632(auVar111),ZEXT1632(auVar147),auVar91);
            auVar151 = vpackssdw_avx(local_500._0_16_,local_500._16_16_);
            auVar145 = vblendvps_avx(ZEXT1632(auVar14),auVar145,auVar91);
            auVar191 = vsubps_avx(auVar191,auVar98);
            auVar17 = vsubps_avx(auVar17,auVar142);
            auVar20 = vsubps_avx(auVar145,auVar152);
            auVar18 = vsubps_avx(auVar98,auVar97);
            auVar19 = vsubps_avx(auVar142,auVar121);
            auVar90 = vsubps_avx(auVar152,auVar5);
            auVar171._0_4_ = auVar20._0_4_ * auVar98._0_4_;
            auVar171._4_4_ = auVar20._4_4_ * auVar98._4_4_;
            auVar171._8_4_ = auVar20._8_4_ * auVar98._8_4_;
            auVar171._12_4_ = auVar20._12_4_ * auVar98._12_4_;
            auVar171._16_4_ = auVar20._16_4_ * auVar98._16_4_;
            auVar171._20_4_ = auVar20._20_4_ * auVar98._20_4_;
            auVar171._24_4_ = auVar20._24_4_ * auVar98._24_4_;
            auVar171._28_4_ = 0;
            auVar13 = vfmsub231ps_fma(auVar171,auVar152,auVar191);
            auVar62._4_4_ = auVar191._4_4_ * auVar142._4_4_;
            auVar62._0_4_ = auVar191._0_4_ * auVar142._0_4_;
            auVar62._8_4_ = auVar191._8_4_ * auVar142._8_4_;
            auVar62._12_4_ = auVar191._12_4_ * auVar142._12_4_;
            auVar62._16_4_ = auVar191._16_4_ * auVar142._16_4_;
            auVar62._20_4_ = auVar191._20_4_ * auVar142._20_4_;
            auVar62._24_4_ = auVar191._24_4_ * auVar142._24_4_;
            auVar62._28_4_ = auVar145._28_4_;
            auVar14 = vfmsub231ps_fma(auVar62,auVar98,auVar17);
            auVar13 = vfmadd231ps_fma(ZEXT1632(auVar14),ZEXT832(0) << 0x20,ZEXT1632(auVar13));
            auVar172._0_4_ = auVar17._0_4_ * auVar152._0_4_;
            auVar172._4_4_ = auVar17._4_4_ * auVar152._4_4_;
            auVar172._8_4_ = auVar17._8_4_ * auVar152._8_4_;
            auVar172._12_4_ = auVar17._12_4_ * auVar152._12_4_;
            auVar172._16_4_ = auVar17._16_4_ * auVar152._16_4_;
            auVar172._20_4_ = auVar17._20_4_ * auVar152._20_4_;
            auVar172._24_4_ = auVar17._24_4_ * auVar152._24_4_;
            auVar172._28_4_ = 0;
            auVar14 = vfmsub231ps_fma(auVar172,auVar142,auVar20);
            auVar14 = vfmadd231ps_fma(ZEXT1632(auVar13),ZEXT832(0) << 0x20,ZEXT1632(auVar14));
            auVar173._0_4_ = auVar90._0_4_ * auVar97._0_4_;
            auVar173._4_4_ = auVar90._4_4_ * auVar97._4_4_;
            auVar173._8_4_ = auVar90._8_4_ * auVar97._8_4_;
            auVar173._12_4_ = auVar90._12_4_ * auVar97._12_4_;
            auVar173._16_4_ = auVar90._16_4_ * auVar97._16_4_;
            auVar173._20_4_ = auVar90._20_4_ * auVar97._20_4_;
            auVar173._24_4_ = auVar90._24_4_ * auVar97._24_4_;
            auVar173._28_4_ = 0;
            auVar13 = vfmsub231ps_fma(auVar173,auVar18,auVar5);
            auVar63._4_4_ = auVar19._4_4_ * auVar5._4_4_;
            auVar63._0_4_ = auVar19._0_4_ * auVar5._0_4_;
            auVar63._8_4_ = auVar19._8_4_ * auVar5._8_4_;
            auVar63._12_4_ = auVar19._12_4_ * auVar5._12_4_;
            auVar63._16_4_ = auVar19._16_4_ * auVar5._16_4_;
            auVar63._20_4_ = auVar19._20_4_ * auVar5._20_4_;
            auVar63._24_4_ = auVar19._24_4_ * auVar5._24_4_;
            auVar63._28_4_ = auVar5._28_4_;
            auVar15 = vfmsub231ps_fma(auVar63,auVar121,auVar90);
            auVar64._4_4_ = auVar18._4_4_ * auVar121._4_4_;
            auVar64._0_4_ = auVar18._0_4_ * auVar121._0_4_;
            auVar64._8_4_ = auVar18._8_4_ * auVar121._8_4_;
            auVar64._12_4_ = auVar18._12_4_ * auVar121._12_4_;
            auVar64._16_4_ = auVar18._16_4_ * auVar121._16_4_;
            auVar64._20_4_ = auVar18._20_4_ * auVar121._20_4_;
            auVar64._24_4_ = auVar18._24_4_ * auVar121._24_4_;
            auVar64._28_4_ = auVar121._28_4_;
            auVar87 = vfmsub231ps_fma(auVar64,auVar19,auVar97);
            auVar121 = ZEXT832(0) << 0x20;
            auVar13 = vfmadd231ps_fma(ZEXT1632(auVar87),auVar121,ZEXT1632(auVar13));
            auVar15 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar121,ZEXT1632(auVar15));
            auVar97 = vmaxps_avx(ZEXT1632(auVar14),ZEXT1632(auVar15));
            auVar97 = vcmpps_avx(auVar97,ZEXT832(0) << 0x20,2);
            auVar13 = vpackssdw_avx(auVar97._0_16_,auVar97._16_16_);
            auVar151 = vpand_avx(auVar13,auVar151);
            auVar97 = vpmovsxwd_avx2(auVar151);
            auVar174 = ZEXT3264(auVar97);
            if ((((((((auVar97 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar97 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar97 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar97 >> 0x7f,0) == '\0') &&
                  (auVar97 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar97 >> 0xbf,0) == '\0') &&
                (auVar97 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar97[0x1f]) {
LAB_015eeda0:
              auVar155._8_8_ = local_5a0[1]._8_8_;
              auVar155._0_8_ = local_5a0[1]._0_8_;
              auVar155._16_8_ = local_5a0[1]._16_8_;
              auVar155._24_8_ = local_5a0[1]._24_8_;
            }
            else {
              auVar65._4_4_ = auVar17._4_4_ * auVar90._4_4_;
              auVar65._0_4_ = auVar17._0_4_ * auVar90._0_4_;
              auVar65._8_4_ = auVar17._8_4_ * auVar90._8_4_;
              auVar65._12_4_ = auVar17._12_4_ * auVar90._12_4_;
              auVar65._16_4_ = auVar17._16_4_ * auVar90._16_4_;
              auVar65._20_4_ = auVar17._20_4_ * auVar90._20_4_;
              auVar65._24_4_ = auVar17._24_4_ * auVar90._24_4_;
              auVar65._28_4_ = auVar97._28_4_;
              auVar131 = vfmsub231ps_fma(auVar65,auVar19,auVar20);
              auVar175._0_4_ = auVar18._0_4_ * auVar20._0_4_;
              auVar175._4_4_ = auVar18._4_4_ * auVar20._4_4_;
              auVar175._8_4_ = auVar18._8_4_ * auVar20._8_4_;
              auVar175._12_4_ = auVar18._12_4_ * auVar20._12_4_;
              auVar175._16_4_ = auVar18._16_4_ * auVar20._16_4_;
              auVar175._20_4_ = auVar18._20_4_ * auVar20._20_4_;
              auVar175._24_4_ = auVar18._24_4_ * auVar20._24_4_;
              auVar175._28_4_ = 0;
              auVar86 = vfmsub231ps_fma(auVar175,auVar191,auVar90);
              auVar66._4_4_ = auVar191._4_4_ * auVar19._4_4_;
              auVar66._0_4_ = auVar191._0_4_ * auVar19._0_4_;
              auVar66._8_4_ = auVar191._8_4_ * auVar19._8_4_;
              auVar66._12_4_ = auVar191._12_4_ * auVar19._12_4_;
              auVar66._16_4_ = auVar191._16_4_ * auVar19._16_4_;
              auVar66._20_4_ = auVar191._20_4_ * auVar19._20_4_;
              auVar66._24_4_ = auVar191._24_4_ * auVar19._24_4_;
              auVar66._28_4_ = auVar19._28_4_;
              auVar111 = vfmsub231ps_fma(auVar66,auVar18,auVar17);
              auVar13 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar86),ZEXT1632(auVar111));
              auVar87 = vfmadd231ps_fma(ZEXT1632(auVar13),ZEXT1632(auVar131),auVar121);
              auVar97 = vrcpps_avx(ZEXT1632(auVar87));
              auVar208._8_4_ = 0x3f800000;
              auVar208._0_8_ = 0x3f8000003f800000;
              auVar208._12_4_ = 0x3f800000;
              auVar208._16_4_ = 0x3f800000;
              auVar208._20_4_ = 0x3f800000;
              auVar208._24_4_ = 0x3f800000;
              auVar208._28_4_ = 0x3f800000;
              auVar209 = ZEXT3264(auVar208);
              auVar13 = vfnmadd213ps_fma(auVar97,ZEXT1632(auVar87),auVar208);
              auVar13 = vfmadd132ps_fma(ZEXT1632(auVar13),auVar97,auVar97);
              auVar67._4_4_ = auVar111._4_4_ * auVar152._4_4_;
              auVar67._0_4_ = auVar111._0_4_ * auVar152._0_4_;
              auVar67._8_4_ = auVar111._8_4_ * auVar152._8_4_;
              auVar67._12_4_ = auVar111._12_4_ * auVar152._12_4_;
              auVar67._16_4_ = auVar152._16_4_ * 0.0;
              auVar67._20_4_ = auVar152._20_4_ * 0.0;
              auVar67._24_4_ = auVar152._24_4_ * 0.0;
              auVar67._28_4_ = auVar20._28_4_;
              auVar86 = vfmadd231ps_fma(auVar67,auVar142,ZEXT1632(auVar86));
              auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),ZEXT1632(auVar131),auVar98);
              fVar130 = auVar13._0_4_;
              fVar129 = auVar13._4_4_;
              fVar102 = auVar13._8_4_;
              fVar104 = auVar13._12_4_;
              auVar97 = ZEXT1632(CONCAT412(fVar104 * auVar86._12_4_,
                                           CONCAT48(fVar102 * auVar86._8_4_,
                                                    CONCAT44(fVar129 * auVar86._4_4_,
                                                             fVar130 * auVar86._0_4_))));
              auVar174 = ZEXT3264(auVar97);
              uVar109 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar154._4_4_ = uVar109;
              auVar154._0_4_ = uVar109;
              auVar154._8_4_ = uVar109;
              auVar154._12_4_ = uVar109;
              auVar154._16_4_ = uVar109;
              auVar154._20_4_ = uVar109;
              auVar154._24_4_ = uVar109;
              auVar154._28_4_ = uVar109;
              auVar98 = vcmpps_avx(local_340,auVar97,2);
              auVar142 = vcmpps_avx(auVar97,auVar154,2);
              auVar98 = vandps_avx(auVar142,auVar98);
              auVar13 = vpackssdw_avx(auVar98._0_16_,auVar98._16_16_);
              auVar151 = vpand_avx(auVar151,auVar13);
              auVar98 = vpmovsxwd_avx2(auVar151);
              if ((((((((auVar98 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar98 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar98 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar98 >> 0x7f,0) == '\0') &&
                    (auVar98 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar98 >> 0xbf,0) == '\0') &&
                  (auVar98 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar98[0x1f]) goto LAB_015eeda0;
              auVar98 = vcmpps_avx(ZEXT1632(auVar87),ZEXT832(0) << 0x20,4);
              auVar13 = vpackssdw_avx(auVar98._0_16_,auVar98._16_16_);
              auVar151 = vpand_avx(auVar151,auVar13);
              auVar98 = vpmovsxwd_avx2(auVar151);
              auVar155._8_8_ = local_5a0[1]._8_8_;
              auVar155._0_8_ = local_5a0[1]._0_8_;
              auVar155._16_8_ = local_5a0[1]._16_8_;
              auVar155._24_8_ = local_5a0[1]._24_8_;
              if ((((((((auVar98 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar98 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar98 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar98 >> 0x7f,0) != '\0') ||
                    (auVar98 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar98 >> 0xbf,0) != '\0') ||
                  (auVar98 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar98[0x1f] < '\0') {
                auVar121 = ZEXT1632(CONCAT412(fVar104 * auVar14._12_4_,
                                              CONCAT48(fVar102 * auVar14._8_4_,
                                                       CONCAT44(fVar129 * auVar14._4_4_,
                                                                fVar130 * auVar14._0_4_))));
                auVar68._28_4_ = SUB84(local_5a0[1]._24_8_,4);
                auVar68._0_28_ =
                     ZEXT1628(CONCAT412(fVar104 * auVar15._12_4_,
                                        CONCAT48(fVar102 * auVar15._8_4_,
                                                 CONCAT44(fVar129 * auVar15._4_4_,
                                                          fVar130 * auVar15._0_4_))));
                auVar184._8_4_ = 0x3f800000;
                auVar184._0_8_ = 0x3f8000003f800000;
                auVar184._12_4_ = 0x3f800000;
                auVar184._16_4_ = 0x3f800000;
                auVar184._20_4_ = 0x3f800000;
                auVar184._24_4_ = 0x3f800000;
                auVar184._28_4_ = 0x3f800000;
                auVar142 = vsubps_avx(auVar184,auVar121);
                local_c0 = vblendvps_avx(auVar142,auVar121,auVar91);
                auVar142 = vsubps_avx(auVar184,auVar68);
                local_380 = vblendvps_avx(auVar142,auVar68,auVar91);
                auVar155 = auVar98;
                local_540 = auVar97;
              }
            }
            auVar215 = ZEXT3264(local_780);
            auVar203 = ZEXT3264(local_760);
            auVar192 = ZEXT3264(local_680);
            auVar91 = local_640;
            if ((((((((auVar155 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar155 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar155 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar155 >> 0x7f,0) != '\0') ||
                  (auVar155 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar155 >> 0xbf,0) != '\0') ||
                (auVar155 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar155[0x1f] < '\0') {
              auVar98 = vsubps_avx(ZEXT1632(auVar12),local_6e0);
              auVar151 = vfmadd213ps_fma(auVar98,local_c0,local_6e0);
              fVar130 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
              auVar69._4_4_ = (auVar151._4_4_ + auVar151._4_4_) * fVar130;
              auVar69._0_4_ = (auVar151._0_4_ + auVar151._0_4_) * fVar130;
              auVar69._8_4_ = (auVar151._8_4_ + auVar151._8_4_) * fVar130;
              auVar69._12_4_ = (auVar151._12_4_ + auVar151._12_4_) * fVar130;
              auVar69._16_4_ = fVar130 * 0.0;
              auVar69._20_4_ = fVar130 * 0.0;
              auVar69._24_4_ = fVar130 * 0.0;
              auVar69._28_4_ = fVar130;
              auVar98 = vcmpps_avx(local_540,auVar69,6);
              auVar142 = auVar155 & auVar98;
              if ((((((((auVar142 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar142 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar142 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar142 >> 0x7f,0) != '\0') ||
                    (auVar142 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar142 >> 0xbf,0) != '\0') ||
                  (auVar142 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar142[0x1f] < '\0') {
                auVar124._8_4_ = 0xbf800000;
                auVar124._0_8_ = 0xbf800000bf800000;
                auVar124._12_4_ = 0xbf800000;
                auVar124._16_4_ = 0xbf800000;
                auVar124._20_4_ = 0xbf800000;
                auVar124._24_4_ = 0xbf800000;
                auVar124._28_4_ = 0xbf800000;
                auVar146._8_4_ = 0x40000000;
                auVar146._0_8_ = 0x4000000040000000;
                auVar146._12_4_ = 0x40000000;
                auVar146._16_4_ = 0x40000000;
                auVar146._20_4_ = 0x40000000;
                auVar146._24_4_ = 0x40000000;
                auVar146._28_4_ = 0x40000000;
                auVar151 = vfmadd213ps_fma(local_380,auVar146,auVar124);
                auVar174 = ZEXT1664(auVar151);
                local_280 = local_c0;
                local_380 = ZEXT1632(auVar151);
                auVar142 = local_380;
                local_260 = ZEXT1632(auVar151);
                local_240 = local_540;
                local_21c = iVar9;
                local_210 = local_720._0_8_;
                uStack_208 = local_720._8_8_;
                local_200 = local_7c0;
                uStack_1f8 = uStack_7b8;
                local_1f0 = local_7d0;
                uStack_1e8 = uStack_7c8;
                local_1e0 = local_730;
                uStack_1d8 = uStack_728;
                pGVar10 = (context->scene->geometries).items[uVar7].ptr;
                local_380 = auVar142;
                if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  local_5a0[0] = vandps_avx(auVar98,auVar155);
                  fVar130 = (float)local_220;
                  local_1a0[0] = (fVar130 + local_c0._0_4_ + 0.0) * local_e0;
                  local_1a0[1] = (fVar130 + local_c0._4_4_ + 1.0) * fStack_dc;
                  local_1a0[2] = (fVar130 + local_c0._8_4_ + 2.0) * fStack_d8;
                  local_1a0[3] = (fVar130 + local_c0._12_4_ + 3.0) * fStack_d4;
                  fStack_190 = (fVar130 + local_c0._16_4_ + 4.0) * fStack_d0;
                  fStack_18c = (fVar130 + local_c0._20_4_ + 5.0) * fStack_cc;
                  fStack_188 = (fVar130 + local_c0._24_4_ + 6.0) * fStack_c8;
                  fStack_184 = fVar130 + local_c0._28_4_ + 7.0;
                  local_380._0_8_ = auVar151._0_8_;
                  local_380._8_8_ = auVar151._8_8_;
                  local_180 = local_380._0_8_;
                  uStack_178 = local_380._8_8_;
                  uStack_170 = 0;
                  uStack_168 = 0;
                  local_160 = local_540;
                  auVar125._8_4_ = 0x7f800000;
                  auVar125._0_8_ = 0x7f8000007f800000;
                  auVar125._12_4_ = 0x7f800000;
                  auVar125._16_4_ = 0x7f800000;
                  auVar125._20_4_ = 0x7f800000;
                  auVar125._24_4_ = 0x7f800000;
                  auVar125._28_4_ = 0x7f800000;
                  auVar98 = vblendvps_avx(auVar125,local_540,local_5a0[0]);
                  auVar142 = vshufps_avx(auVar98,auVar98,0xb1);
                  auVar142 = vminps_avx(auVar98,auVar142);
                  auVar97 = vshufpd_avx(auVar142,auVar142,5);
                  auVar142 = vminps_avx(auVar142,auVar97);
                  auVar97 = vpermpd_avx2(auVar142,0x4e);
                  auVar142 = vminps_avx(auVar142,auVar97);
                  auVar142 = vcmpps_avx(auVar98,auVar142,0);
                  auVar97 = local_5a0[0] & auVar142;
                  auVar98 = local_5a0[0];
                  if ((((((((auVar97 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar97 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar97 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar97 >> 0x7f,0) != '\0') ||
                        (auVar97 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar97 >> 0xbf,0) != '\0') ||
                      (auVar97 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar97[0x1f] < '\0') {
                    auVar98 = vandps_avx(auVar142,local_5a0[0]);
                  }
                  uVar75 = vmovmskps_avx(auVar98);
                  uVar78 = 0;
                  for (; (uVar75 & 1) == 0; uVar75 = uVar75 >> 1 | 0x80000000) {
                    uVar78 = uVar78 + 1;
                  }
                  uVar76 = (ulong)uVar78;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar130 = local_1a0[uVar76];
                    uVar109 = *(undefined4 *)((long)&local_180 + uVar76 * 4);
                    fVar102 = 1.0 - fVar130;
                    fVar129 = fVar102 * fVar102 * -3.0;
                    auVar151 = vfmadd231ss_fma(ZEXT416((uint)(fVar102 * fVar102)),
                                               ZEXT416((uint)(fVar130 * fVar102)),
                                               ZEXT416(0xc0000000));
                    auVar12 = vfmsub132ss_fma(ZEXT416((uint)(fVar130 * fVar102)),
                                              ZEXT416((uint)(fVar130 * fVar130)),ZEXT416(0x40000000)
                                             );
                    fVar102 = auVar151._0_4_ * 3.0;
                    fVar104 = auVar12._0_4_ * 3.0;
                    fVar193 = fVar130 * fVar130 * 3.0;
                    auVar167._0_4_ = fVar193 * (float)local_730._0_4_;
                    auVar167._4_4_ = fVar193 * (float)local_730._4_4_;
                    auVar167._8_4_ = fVar193 * (float)uStack_728;
                    auVar167._12_4_ = fVar193 * uStack_728._4_4_;
                    auVar174 = ZEXT1664(auVar167);
                    auVar136._4_4_ = fVar104;
                    auVar136._0_4_ = fVar104;
                    auVar136._8_4_ = fVar104;
                    auVar136._12_4_ = fVar104;
                    auVar151 = vfmadd132ps_fma(auVar136,auVar167,auVar16);
                    auVar150._4_4_ = fVar102;
                    auVar150._0_4_ = fVar102;
                    auVar150._8_4_ = fVar102;
                    auVar150._12_4_ = fVar102;
                    auVar151 = vfmadd132ps_fma(auVar150,auVar151,auVar85);
                    auVar137._4_4_ = fVar129;
                    auVar137._0_4_ = fVar129;
                    auVar137._8_4_ = fVar129;
                    auVar137._12_4_ = fVar129;
                    auVar151 = vfmadd132ps_fma(auVar137,auVar151,local_720);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_160 + uVar76 * 4);
                    *(int *)(ray + k * 4 + 0xc0) = auVar151._0_4_;
                    uVar179 = vextractps_avx(auVar151,1);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar179;
                    uVar179 = vextractps_avx(auVar151,2);
                    *(undefined4 *)(ray + k * 4 + 0xe0) = uVar179;
                    *(float *)(ray + k * 4 + 0xf0) = fVar130;
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar109;
                    *(uint *)(ray + k * 4 + 0x110) = uVar8;
                    *(uint *)(ray + k * 4 + 0x120) = uVar7;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  }
                  else {
                    local_6e0 = ZEXT1632(*local_650);
                    local_860._16_16_ = auVar152._16_16_;
                    local_860._0_16_ = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                    local_658 = context;
                    _local_4c0 = auVar187;
                    while( true ) {
                      auVar98 = local_860._0_32_;
                      local_3e0 = local_1a0[uVar76];
                      local_3d0 = *(undefined4 *)((long)&local_180 + uVar76 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_160 + uVar76 * 4);
                      fVar102 = 1.0 - local_3e0;
                      auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar102 * fVar102)),
                                                ZEXT416((uint)(local_3e0 * fVar102)),
                                                ZEXT416(0xc0000000));
                      auVar151 = vfmsub132ss_fma(ZEXT416((uint)(local_3e0 * fVar102)),
                                                 ZEXT416((uint)(local_3e0 * local_3e0)),
                                                 ZEXT416(0x40000000));
                      fVar130 = auVar151._0_4_ * 3.0;
                      fVar129 = local_3e0 * local_3e0 * 3.0;
                      auVar168._0_4_ = fVar129 * (float)local_730._0_4_;
                      auVar168._4_4_ = fVar129 * (float)local_730._4_4_;
                      auVar168._8_4_ = fVar129 * (float)uStack_728;
                      auVar168._12_4_ = fVar129 * uStack_728._4_4_;
                      auVar174 = ZEXT1664(auVar168);
                      auVar138._4_4_ = fVar130;
                      auVar138._0_4_ = fVar130;
                      auVar138._8_4_ = fVar130;
                      auVar138._12_4_ = fVar130;
                      auVar151 = vfmadd132ps_fma(auVar138,auVar168,auVar16);
                      fVar130 = auVar12._0_4_ * 3.0;
                      auVar159._4_4_ = fVar130;
                      auVar159._0_4_ = fVar130;
                      auVar159._8_4_ = fVar130;
                      auVar159._12_4_ = fVar130;
                      auVar151 = vfmadd132ps_fma(auVar159,auVar151,auVar85);
                      fVar130 = fVar102 * fVar102 * -3.0;
                      local_710.context = context->user;
                      auVar139._4_4_ = fVar130;
                      auVar139._0_4_ = fVar130;
                      auVar139._8_4_ = fVar130;
                      auVar139._12_4_ = fVar130;
                      auVar12 = vfmadd132ps_fma(auVar139,auVar151,local_720);
                      local_410 = auVar12._0_4_;
                      uStack_40c = local_410;
                      uStack_408 = local_410;
                      uStack_404 = local_410;
                      auVar151 = vshufps_avx(auVar12,auVar12,0x55);
                      local_400 = auVar151;
                      local_3f0 = vshufps_avx(auVar12,auVar12,0xaa);
                      fStack_3dc = local_3e0;
                      fStack_3d8 = local_3e0;
                      fStack_3d4 = local_3e0;
                      uStack_3cc = local_3d0;
                      uStack_3c8 = local_3d0;
                      uStack_3c4 = local_3d0;
                      local_3c0 = CONCAT44(uStack_2ac,local_2b0);
                      uStack_3b8 = CONCAT44(uStack_2a4,uStack_2a8);
                      local_3b0 = _local_5d0;
                      vpcmpeqd_avx2(ZEXT1632(_local_5d0),ZEXT1632(_local_5d0));
                      uStack_39c = (local_710.context)->instID[0];
                      local_3a0 = uStack_39c;
                      uStack_398 = uStack_39c;
                      uStack_394 = uStack_39c;
                      uStack_390 = (local_710.context)->instPrimID[0];
                      uStack_38c = uStack_390;
                      uStack_388 = uStack_390;
                      uStack_384 = uStack_390;
                      local_7b0 = local_6e0._0_16_;
                      local_710.valid = (int *)local_7b0;
                      local_710.geometryUserPtr = pGVar10->userPtr;
                      local_710.hit = (RTCHitN *)&local_410;
                      local_710.N = 4;
                      local_710.ray = (RTCRayN *)ray;
                      if (pGVar10->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar174 = ZEXT1664(auVar168);
                        auVar209 = ZEXT1664(auVar209._0_16_);
                        (*pGVar10->intersectionFilterN)(&local_710);
                        context = local_658;
                      }
                      if (local_7b0 == (undefined1  [16])0x0) {
                        auVar151 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                        auVar151 = auVar151 ^ _DAT_01f7ae20;
                      }
                      else {
                        p_Var11 = context->args->filter;
                        if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar174 = ZEXT1664(auVar174._0_16_);
                          auVar209 = ZEXT1664(auVar209._0_16_);
                          (*p_Var11)(&local_710);
                          context = local_658;
                        }
                        auVar12 = vpcmpeqd_avx(local_7b0,_DAT_01f7aa10);
                        auVar13 = vpcmpeqd_avx(auVar151,auVar151);
                        auVar151 = auVar12 ^ auVar13;
                        if (local_7b0 != (undefined1  [16])0x0) {
                          auVar12 = auVar12 ^ auVar13;
                          auVar13 = vmaskmovps_avx(auVar12,*(undefined1 (*) [16])local_710.hit);
                          *(undefined1 (*) [16])(local_710.ray + 0xc0) = auVar13;
                          auVar13 = vmaskmovps_avx(auVar12,*(undefined1 (*) [16])
                                                            (local_710.hit + 0x10));
                          *(undefined1 (*) [16])(local_710.ray + 0xd0) = auVar13;
                          auVar13 = vmaskmovps_avx(auVar12,*(undefined1 (*) [16])
                                                            (local_710.hit + 0x20));
                          *(undefined1 (*) [16])(local_710.ray + 0xe0) = auVar13;
                          auVar13 = vmaskmovps_avx(auVar12,*(undefined1 (*) [16])
                                                            (local_710.hit + 0x30));
                          *(undefined1 (*) [16])(local_710.ray + 0xf0) = auVar13;
                          auVar13 = vmaskmovps_avx(auVar12,*(undefined1 (*) [16])
                                                            (local_710.hit + 0x40));
                          *(undefined1 (*) [16])(local_710.ray + 0x100) = auVar13;
                          auVar13 = vmaskmovps_avx(auVar12,*(undefined1 (*) [16])
                                                            (local_710.hit + 0x50));
                          *(undefined1 (*) [16])(local_710.ray + 0x110) = auVar13;
                          auVar13 = vmaskmovps_avx(auVar12,*(undefined1 (*) [16])
                                                            (local_710.hit + 0x60));
                          *(undefined1 (*) [16])(local_710.ray + 0x120) = auVar13;
                          auVar13 = vmaskmovps_avx(auVar12,*(undefined1 (*) [16])
                                                            (local_710.hit + 0x70));
                          *(undefined1 (*) [16])(local_710.ray + 0x130) = auVar13;
                          auVar12 = vmaskmovps_avx(auVar12,*(undefined1 (*) [16])
                                                            (local_710.hit + 0x80));
                          *(undefined1 (*) [16])(local_710.ray + 0x140) = auVar12;
                        }
                      }
                      auVar142 = local_540;
                      auVar114._8_8_ = 0x100000001;
                      auVar114._0_8_ = 0x100000001;
                      if ((auVar114 & auVar151) == (undefined1  [16])0x0) {
                        *(undefined4 *)(ray + k * 4 + 0x80) = local_860._0_4_;
                      }
                      else {
                        local_860._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                        local_860._4_4_ = 0;
                        local_860._8_4_ = 0;
                        local_860._12_4_ = 0;
                      }
                      *(undefined4 *)(local_5a0[0] + uVar76 * 4) = 0;
                      local_860._16_16_ = auVar98._16_16_;
                      auVar99._4_4_ = local_860._0_4_;
                      auVar99._0_4_ = local_860._0_4_;
                      auVar99._8_4_ = local_860._0_4_;
                      auVar99._12_4_ = local_860._0_4_;
                      auVar99._16_4_ = local_860._0_4_;
                      auVar99._20_4_ = local_860._0_4_;
                      auVar99._24_4_ = local_860._0_4_;
                      auVar99._28_4_ = local_860._0_4_;
                      auVar152 = vcmpps_avx(auVar142,auVar99,2);
                      auVar98 = vandps_avx(auVar152,local_5a0[0]);
                      local_5a0[0] = local_5a0[0] & auVar152;
                      if ((((((((local_5a0[0] >> 0x1f & (undefined1  [32])0x1) ==
                                (undefined1  [32])0x0 &&
                               (local_5a0[0] >> 0x3f & (undefined1  [32])0x1) ==
                               (undefined1  [32])0x0) &&
                              (local_5a0[0] >> 0x5f & (undefined1  [32])0x1) ==
                              (undefined1  [32])0x0) && SUB321(local_5a0[0] >> 0x7f,0) == '\0') &&
                            (local_5a0[0] & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                           && SUB321(local_5a0[0] >> 0xbf,0) == '\0') &&
                          (local_5a0[0] & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                          && -1 < local_5a0[0][0x1f]) break;
                      auVar126._8_4_ = 0x7f800000;
                      auVar126._0_8_ = 0x7f8000007f800000;
                      auVar126._12_4_ = 0x7f800000;
                      auVar126._16_4_ = 0x7f800000;
                      auVar126._20_4_ = 0x7f800000;
                      auVar126._24_4_ = 0x7f800000;
                      auVar126._28_4_ = 0x7f800000;
                      auVar142 = vblendvps_avx(auVar126,auVar142,auVar98);
                      auVar152 = vshufps_avx(auVar142,auVar142,0xb1);
                      auVar152 = vminps_avx(auVar142,auVar152);
                      auVar97 = vshufpd_avx(auVar152,auVar152,5);
                      auVar152 = vminps_avx(auVar152,auVar97);
                      auVar97 = vpermpd_avx2(auVar152,0x4e);
                      auVar152 = vminps_avx(auVar152,auVar97);
                      auVar152 = vcmpps_avx(auVar142,auVar152,0);
                      auVar97 = auVar98 & auVar152;
                      auVar142 = auVar98;
                      if ((((((((auVar97 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar97 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar97 >> 0x5f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar97 >> 0x7f,0) != '\0') ||
                            (auVar97 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar97 >> 0xbf,0) != '\0') ||
                          (auVar97 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar97[0x1f] < '\0') {
                        auVar142 = vandps_avx(auVar152,auVar98);
                      }
                      uVar75 = vmovmskps_avx(auVar142);
                      uVar78 = 0;
                      for (; (uVar75 & 1) == 0; uVar75 = uVar75 >> 1 | 0x80000000) {
                        uVar78 = uVar78 + 1;
                      }
                      uVar76 = (ulong)uVar78;
                      local_5a0[0] = auVar98;
                    }
                    auVar192 = ZEXT3264(local_680);
                    auVar203 = ZEXT3264(local_760);
                    auVar215 = ZEXT3264(local_780);
                    pre = local_790;
                    prim = local_788;
                    pLVar81 = local_798;
                    auVar91 = local_640;
                  }
                }
              }
            }
          }
          auVar128 = ZEXT3264(auVar91);
          lVar77 = lVar77 + 8;
          fVar129 = (float)local_5c0;
          fVar102 = local_5c0._4_4_;
          fVar104 = (float)uStack_5b8;
          fVar193 = uStack_5b8._4_4_;
          fVar194 = (float)uStack_5b0;
          fVar195 = uStack_5b0._4_4_;
          fVar156 = (float)uStack_5a8;
        } while ((int)lVar77 < iVar9);
      }
      uVar109 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar89._4_4_ = uVar109;
      auVar89._0_4_ = uVar109;
      auVar89._8_4_ = uVar109;
      auVar89._12_4_ = uVar109;
      auVar151 = vcmpps_avx(local_2a0,auVar89,2);
      uVar78 = vmovmskps_avx(auVar151);
      uVar74 = uVar74 & uVar74 + 0xf & uVar78;
    } while (uVar74 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_h(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID));
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }